

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  _func_int *p_Var8;
  int *piVar9;
  long lVar10;
  void *pvVar11;
  size_t sVar12;
  bool bVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float afVar120 [16];
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  int iVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  int iVar135;
  ulong uVar136;
  long lVar137;
  long lVar138;
  long lVar139;
  undefined1 (*pauVar140) [16];
  undefined1 (*pauVar141) [32];
  long lVar142;
  long lVar143;
  undefined1 (*pauVar144) [32];
  int iVar145;
  long lVar146;
  long lVar147;
  uint uVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  long lVar156;
  ulong uVar157;
  undefined1 (*pauVar158) [16];
  undefined1 (*pauVar159) [16];
  long lVar160;
  undefined1 (*pauVar161) [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  float fVar222;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar223 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar226 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar255;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar256;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  v4sf one;
  undefined1 auVar286 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar287 [16];
  undefined1 auVar290 [64];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  undefined1 auVar297 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar298 [16];
  undefined1 auVar301 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [64];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  undefined1 auVar324 [16];
  undefined1 auVar323 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar325 [16];
  undefined1 auVar328 [64];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar336 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar337 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbdc;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  long local_358;
  undefined1 (*local_308) [32];
  int *piStack_300;
  size_t local_2f8;
  int local_2f0;
  Allocator *local_2e8;
  int local_2e0;
  int local_2dc;
  undefined8 local_2d8;
  int local_2d0;
  size_t local_2c8;
  undefined1 local_2b8 [16];
  float local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined1 local_298 [32];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar162 = in_ZMM29._0_16_;
  local_2e0 = bottom_blob->dims;
  if (local_2e0 == 2) {
    local_2dc = bottom_blob->w;
    if (local_2dc ==
        *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
        *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var8 = this->_vptr_InnerProduct_x86_avx512[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 *(Mat **)(&this->field_0x178 + (long)p_Var8),
                 *(int *)(&this->field_0xe0 + (long)p_Var8),
                 (Mat *)(&this->field_0xe8 + (long)p_Var8),
                 (Option *)CONCAT44(in_stack_fffffffffffffbdc,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_2dc = bottom_blob->w;
  }
  piVar9 = bottom_blob->refcount;
  local_308 = (undefined1 (*) [32])bottom_blob->data;
  piStack_300 = bottom_blob->refcount;
  local_2f8 = bottom_blob->elemsize;
  local_2f0 = bottom_blob->elempack;
  local_2e8 = bottom_blob->allocator;
  local_2d8._0_4_ = bottom_blob->h;
  local_2d8._4_4_ = bottom_blob->d;
  local_2d0 = bottom_blob->c;
  local_2c8 = bottom_blob->cstep;
  iVar145 = local_2e0;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
    iVar145 = bottom_blob->dims;
  }
  if (iVar145 != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_308);
  }
  uVar133 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  uVar134 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar133 & 0xf) == 0) {
      uVar134 = 0x10;
    }
    else if ((uVar133 & 7) == 0) {
      uVar134 = 8;
    }
    else {
      uVar134 = (uint)((uVar133 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar133 / (int)uVar134,
              (ulong)uVar134 * (local_2f8 / (ulong)(long)local_2f0),uVar134,opt->blob_allocator);
  afVar130 = _ps512_cephes_log_q1;
  afVar129 = _ps512_cephes_exp_p5;
  afVar128 = _ps512_cephes_exp_p4;
  afVar127 = _ps512_cephes_exp_p3;
  afVar126 = _ps512_cephes_exp_p2;
  afVar125 = _ps512_cephes_exp_p1;
  afVar124 = _ps512_cephes_exp_p0;
  afVar123 = _ps512_cephes_LOG2EF;
  afVar122 = _ps512_exp_lo;
  afVar121 = _ps512_exp_hi;
  afVar120 = _ps512_1;
  iVar145 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002a99ee;
  p_Var8 = this->_vptr_InnerProduct_x86_avx512[-3];
  iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var8);
  lVar10 = *(long *)(&this->field_0x178 + (long)p_Var8);
  uVar134 = local_2f0 * local_2dc;
  iVar135 = top_blob->elempack;
  uVar133 = top_blob->w;
  uVar157 = (ulong)uVar133;
  iVar131 = 0;
  iVar145 = iVar131;
  if (iVar135 < 8) {
    if (iVar135 == 1) {
      if (0 < (int)uVar133 >> 3) {
        local_220 = (ulong)(uint)((int)uVar133 >> 3);
        lVar146 = 7;
        lVar142 = 6;
        lVar143 = 5;
        lVar147 = 4;
        lVar149 = 3;
        lVar138 = 2;
        lVar160 = 1;
        local_358 = 0;
        uVar157 = 0;
        do {
          uVar136 = uVar157 * 8;
          auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar10 != 0) {
            auVar301 = ZEXT3264(*(undefined1 (*) [32])(lVar10 + uVar157 * 0x20));
          }
          auVar193 = auVar301._0_32_;
          lVar137 = (long)(this->weight_data_tm).w;
          pvVar11 = (this->weight_data_tm).data;
          sVar12 = (this->weight_data_tm).elemsize;
          pauVar141 = local_308;
          if ((int)uVar134 < 8) {
            lVar137 = sVar12 * lVar137;
            lVar139 = lVar137 * uVar136;
            lVar151 = (uVar136 | 1) * lVar137;
            lVar150 = (uVar136 | 2) * lVar137;
            lVar156 = (uVar136 | 3) * lVar137;
            lVar155 = (uVar136 | 4) * lVar137;
            lVar154 = (uVar136 | 5) * lVar137;
            lVar153 = (uVar136 | 6) * lVar137;
            lVar152 = lVar137 * (uVar136 | 7);
            uVar148 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar152 = sVar12 * lVar146 * lVar137;
            local_298._0_8_ = lVar152;
            lVar153 = sVar12 * lVar142 * lVar137;
            lVar154 = sVar12 * lVar143 * lVar137;
            lVar155 = sVar12 * lVar147 * lVar137;
            lVar156 = sVar12 * lVar149 * lVar137;
            lVar150 = sVar12 * lVar138 * lVar137;
            lVar151 = sVar12 * lVar160 * lVar137;
            lVar137 = sVar12 * local_358 * lVar137;
            auVar290 = ZEXT864(0);
            auVar328 = ZEXT864(0);
            auVar322 = ZEXT864(0);
            auVar317 = ZEXT864(0);
            auVar312 = ZEXT864(0);
            auVar307 = ZEXT864(0);
            auVar302 = ZEXT864(0);
            auVar296 = ZEXT864(0);
            iVar145 = 7;
            lVar139 = 0;
            do {
              auVar194 = *(undefined1 (*) [32])(*local_308 + lVar139 * 2);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar137));
              auVar188 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar151));
              auVar189 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar150));
              auVar190 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar156));
              auVar191 = vcvtph2ps_f16c(auVar162);
              auVar162 = vfmadd231ps_fma(auVar290._0_32_,auVar194,auVar188);
              auVar290 = ZEXT1664(auVar162);
              local_98 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar328._0_32_,auVar194,auVar189);
              auVar328 = ZEXT1664(auVar162);
              local_178 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar322._0_32_,auVar194,auVar190);
              auVar322 = ZEXT1664(auVar162);
              local_158 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar317._0_32_,auVar194,auVar191);
              auVar317 = ZEXT1664(auVar162);
              local_138 = ZEXT1632(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar155));
              auVar188 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar154));
              auVar189 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar153));
              auVar190 = vcvtph2ps_f16c(auVar162);
              auVar162 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar11 + lVar139 + lVar152));
              auVar191 = vcvtph2ps_f16c(auVar162);
              auVar162 = vfmadd231ps_fma(auVar312._0_32_,auVar194,auVar188);
              auVar312 = ZEXT1664(auVar162);
              local_118 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar307._0_32_,auVar194,auVar189);
              auVar307 = ZEXT1664(auVar162);
              local_f8 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar302._0_32_,auVar194,auVar190);
              auVar302 = ZEXT1664(auVar162);
              local_d8 = ZEXT1632(auVar162);
              auVar162 = vfmadd231ps_fma(auVar296._0_32_,auVar194,auVar191);
              auVar296 = ZEXT1664(auVar162);
              local_b8 = ZEXT1632(auVar162);
              pauVar141 = pauVar141 + 1;
              iVar145 = iVar145 + 8;
              lVar139 = lVar139 + 0x10;
            } while (iVar145 < (int)uVar134);
            lVar152 = lVar152 + lVar139;
            lVar153 = lVar153 + lVar139;
            lVar154 = lVar154 + lVar139;
            lVar155 = lVar155 + lVar139;
            lVar156 = lVar156 + lVar139;
            lVar150 = lVar150 + lVar139;
            lVar151 = lVar151 + lVar139;
            lVar139 = lVar137 + lVar139;
            uVar148 = uVar134 & 0xfffffff8;
          }
          if ((int)uVar148 < (int)uVar134) {
            lVar137 = 0;
            do {
              local_298 = auVar301._0_32_;
              uVar132 = *(uint *)(*pauVar141 + lVar137 * 4);
              fVar255 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar11 + lVar137 * 2 + lVar139));
              auVar193 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar255;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar193._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              uVar2 = *(uint *)(*pauVar141 + lVar137 * 4);
              fVar255 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar11 + lVar137 * 2 + lVar151));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar255);
              uVar3 = *(uint *)(*pauVar141 + lVar137 * 4);
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar11 + lVar137 * 2 + lVar150));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(*pauVar141 + lVar137 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar11 + lVar137 * 2 + lVar156));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(*pauVar141 + lVar137 * 4));
              local_2a8 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar11 + lVar137 * 2 + lVar155));
              local_2b8 = ZEXT416(*(uint *)(*pauVar141 + lVar137 * 4));
              uStack_2a4 = extraout_XMM0_Db_03;
              uStack_2a0 = extraout_XMM0_Dc_02;
              uStack_29c = extraout_XMM0_Dd_02;
              fVar255 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar11 + lVar137 * 2 + lVar154));
              auVar193 = local_198;
              local_198._4_4_ = extraout_XMM0_Db_04;
              local_198._0_4_ = fVar255;
              local_198._8_4_ = extraout_XMM0_Dc_03;
              local_198._16_16_ = auVar193._16_16_;
              local_198._12_4_ = extraout_XMM0_Dd_03;
              local_1b8._0_16_ = ZEXT416(*(uint *)(*pauVar141 + lVar137 * 4));
              fVar255 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar11 + lVar137 * 2 + lVar153));
              auVar193 = local_1d8;
              local_1d8._4_4_ = extraout_XMM0_Db_05;
              local_1d8._0_4_ = fVar255;
              local_1d8._8_4_ = extraout_XMM0_Dc_04;
              local_1d8._16_16_ = auVar193._16_16_;
              local_1d8._12_4_ = extraout_XMM0_Dd_04;
              local_1f8._0_16_ = ZEXT416(*(uint *)(*pauVar141 + lVar137 * 4));
              auVar301._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar11 + lVar137 * 2 + lVar152));
              auVar301._4_60_ = extraout_var;
              auVar162._4_4_ = uStack_2a4;
              auVar162._0_4_ = local_2a8;
              auVar162._8_4_ = uStack_2a0;
              auVar162._12_4_ = uStack_29c;
              auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_198._0_4_),0x10);
              auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar162 = vinsertps_avx(auVar162,auVar301._0_16_,0x30);
              auVar163 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_248._0_4_),0x20);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_268._0_4_),0x30);
              auVar193._16_16_ = auVar162;
              auVar193._0_16_ = auVar163;
              auVar162 = vinsertps_avx(local_278,ZEXT416((uint)local_2b8._0_4_),0x10);
              auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_1b8._0_4_),0x20);
              auVar162 = vinsertps_avx(auVar162,ZEXT416((uint)local_1f8._0_4_),0x30);
              auVar163 = vinsertps_avx(ZEXT416(uVar132),ZEXT416(uVar2),0x10);
              auVar163 = vinsertps_avx(auVar163,ZEXT416(uVar3),0x20);
              auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_258._0_4_),0x30);
              auVar194._16_16_ = auVar162;
              auVar194._0_16_ = auVar163;
              auVar162 = vfmadd231ps_fma(local_298,auVar193,auVar194);
              auVar301 = ZEXT1664(auVar162);
              auVar193 = ZEXT1632(auVar162);
              lVar137 = lVar137 + 1;
            } while (uVar134 - uVar148 != (int)lVar137);
          }
          auVar194 = vhaddps_avx(local_98,local_178);
          auVar188 = vhaddps_avx(local_158,local_138);
          auVar188 = vhaddps_avx(auVar194,auVar188);
          auVar194 = vhaddps_avx(local_118,local_f8);
          auVar189 = vhaddps_avx(local_d8,local_b8);
          auVar189 = vhaddps_avx(auVar194,auVar189);
          auVar194 = vblendps_avx(auVar188,auVar189,0xf0);
          auVar189 = vperm2f128_avx(auVar188,auVar189,0x21);
          auVar188._0_4_ = auVar189._0_4_ + auVar193._0_4_ + auVar194._0_4_;
          auVar188._4_4_ = auVar189._4_4_ + auVar193._4_4_ + auVar194._4_4_;
          auVar188._8_4_ = auVar189._8_4_ + auVar193._8_4_ + auVar194._8_4_;
          auVar188._12_4_ = auVar189._12_4_ + auVar193._12_4_ + auVar194._12_4_;
          auVar188._16_4_ = auVar189._16_4_ + auVar193._16_4_ + auVar194._16_4_;
          auVar188._20_4_ = auVar189._20_4_ + auVar193._20_4_ + auVar194._20_4_;
          auVar188._24_4_ = auVar189._24_4_ + auVar193._24_4_ + auVar194._24_4_;
          auVar188._28_4_ = auVar189._28_4_ + auVar193._28_4_ + auVar194._28_4_;
          switch(iVar7) {
          case 1:
            auVar188 = vmaxps_avx(auVar188,_DAT_00557200);
            break;
          case 2:
            auVar193 = vmaxps_avx(auVar188,ZEXT832(0) << 0x20);
            auVar194 = vminps_avx(auVar188,ZEXT832(0) << 0x20);
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
            auVar91._4_4_ = uVar1;
            auVar91._0_4_ = uVar1;
            auVar91._8_4_ = uVar1;
            auVar91._12_4_ = uVar1;
            auVar91._16_4_ = uVar1;
            auVar91._20_4_ = uVar1;
            auVar91._24_4_ = uVar1;
            auVar91._28_4_ = uVar1;
            auVar188 = vfmadd132ps_avx512vl(auVar194,auVar193,auVar91);
            break;
          case 3:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
            auVar89._4_4_ = uVar1;
            auVar89._0_4_ = uVar1;
            auVar89._8_4_ = uVar1;
            auVar89._12_4_ = uVar1;
            auVar89._16_4_ = uVar1;
            auVar89._20_4_ = uVar1;
            auVar89._24_4_ = uVar1;
            auVar89._28_4_ = uVar1;
            auVar193 = vmaxps_avx512vl(auVar188,auVar89);
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
            auVar90._4_4_ = uVar1;
            auVar90._0_4_ = uVar1;
            auVar90._8_4_ = uVar1;
            auVar90._12_4_ = uVar1;
            auVar90._16_4_ = uVar1;
            auVar90._20_4_ = uVar1;
            auVar90._24_4_ = uVar1;
            auVar90._28_4_ = uVar1;
            auVar188 = vminps_avx512vl(auVar193,auVar90);
            break;
          case 4:
            auVar78._8_4_ = 0x80000000;
            auVar78._0_8_ = 0x8000000080000000;
            auVar78._12_4_ = 0x80000000;
            auVar78._16_4_ = 0x80000000;
            auVar78._20_4_ = 0x80000000;
            auVar78._24_4_ = 0x80000000;
            auVar78._28_4_ = 0x80000000;
            auVar193 = vxorps_avx512vl(auVar188,auVar78);
            auVar79._8_4_ = 0x42b0c0a5;
            auVar79._0_8_ = 0x42b0c0a542b0c0a5;
            auVar79._12_4_ = 0x42b0c0a5;
            auVar79._16_4_ = 0x42b0c0a5;
            auVar79._20_4_ = 0x42b0c0a5;
            auVar79._24_4_ = 0x42b0c0a5;
            auVar79._28_4_ = 0x42b0c0a5;
            auVar193 = vminps_avx512vl(auVar193,auVar79);
            auVar80._8_4_ = 0xc2b0c0a5;
            auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar80._12_4_ = 0xc2b0c0a5;
            auVar80._16_4_ = 0xc2b0c0a5;
            auVar80._20_4_ = 0xc2b0c0a5;
            auVar80._24_4_ = 0xc2b0c0a5;
            auVar80._28_4_ = 0xc2b0c0a5;
            auVar194 = vmaxps_avx512vl(auVar193,auVar80);
            auVar276._8_4_ = 0x3f000000;
            auVar276._0_8_ = 0x3f0000003f000000;
            auVar276._12_4_ = 0x3f000000;
            auVar276._16_4_ = 0x3f000000;
            auVar276._20_4_ = 0x3f000000;
            auVar276._24_4_ = 0x3f000000;
            auVar276._28_4_ = 0x3f000000;
            auVar81._8_4_ = 0x3fb8aa3b;
            auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar81._12_4_ = 0x3fb8aa3b;
            auVar81._16_4_ = 0x3fb8aa3b;
            auVar81._20_4_ = 0x3fb8aa3b;
            auVar81._24_4_ = 0x3fb8aa3b;
            auVar81._28_4_ = 0x3fb8aa3b;
            auVar188 = vfmadd231ps_avx512vl(auVar276,auVar194,auVar81);
            auVar193 = vroundps_avx(auVar188,1);
            uVar136 = vcmpps_avx512vl(auVar188,auVar193,1);
            auVar284._8_4_ = 0x3f800000;
            auVar284._0_8_ = 0x3f8000003f800000;
            auVar284._12_4_ = 0x3f800000;
            auVar284._16_4_ = 0x3f800000;
            auVar284._20_4_ = 0x3f800000;
            auVar284._24_4_ = 0x3f800000;
            auVar284._28_4_ = 0x3f800000;
            auVar189 = vsubps_avx512vl(auVar193,auVar284);
            bVar13 = (bool)((byte)uVar136 & 1);
            auVar200._0_4_ = (float)((uint)bVar13 * auVar189._0_4_ | (uint)!bVar13 * auVar193._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar200._4_4_ = (float)((uint)bVar13 * auVar189._4_4_ | (uint)!bVar13 * auVar193._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar200._8_4_ = (float)((uint)bVar13 * auVar189._8_4_ | (uint)!bVar13 * auVar193._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar200._12_4_ =
                 (float)((uint)bVar13 * auVar189._12_4_ | (uint)!bVar13 * auVar193._12_4_);
            bVar13 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar200._16_4_ =
                 (float)((uint)bVar13 * auVar189._16_4_ | (uint)!bVar13 * auVar193._16_4_);
            bVar13 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar200._20_4_ =
                 (float)((uint)bVar13 * auVar189._20_4_ | (uint)!bVar13 * auVar193._20_4_);
            bVar13 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar200._24_4_ =
                 (float)((uint)bVar13 * auVar189._24_4_ | (uint)!bVar13 * auVar193._24_4_);
            bVar13 = SUB81(uVar136 >> 7,0);
            auVar200._28_4_ =
                 (float)((uint)bVar13 * auVar189._28_4_ | (uint)!bVar13 * auVar193._28_4_);
            auVar82._8_4_ = 0x3f318000;
            auVar82._0_8_ = 0x3f3180003f318000;
            auVar82._12_4_ = 0x3f318000;
            auVar82._16_4_ = 0x3f318000;
            auVar82._20_4_ = 0x3f318000;
            auVar82._24_4_ = 0x3f318000;
            auVar82._28_4_ = 0x3f318000;
            auVar193 = vfmsub231ps_avx512vl(auVar194,auVar200,auVar82);
            auVar83._8_4_ = 0x395e8083;
            auVar83._0_8_ = 0x395e8083395e8083;
            auVar83._12_4_ = 0x395e8083;
            auVar83._16_4_ = 0x395e8083;
            auVar83._20_4_ = 0x395e8083;
            auVar83._24_4_ = 0x395e8083;
            auVar83._28_4_ = 0x395e8083;
            auVar193 = vfmsub231ps_avx512vl(auVar193,auVar200,auVar83);
            auVar118._4_4_ = auVar193._4_4_ * auVar193._4_4_;
            auVar118._0_4_ = auVar193._0_4_ * auVar193._0_4_;
            auVar118._8_4_ = auVar193._8_4_ * auVar193._8_4_;
            auVar118._12_4_ = auVar193._12_4_ * auVar193._12_4_;
            auVar118._16_4_ = auVar193._16_4_ * auVar193._16_4_;
            auVar118._20_4_ = auVar193._20_4_ * auVar193._20_4_;
            auVar118._24_4_ = auVar193._24_4_ * auVar193._24_4_;
            auVar118._28_4_ = auVar188._28_4_;
            auVar268._8_4_ = 0x39506967;
            auVar268._0_8_ = 0x3950696739506967;
            auVar268._12_4_ = 0x39506967;
            auVar268._16_4_ = 0x39506967;
            auVar268._20_4_ = 0x39506967;
            auVar268._24_4_ = 0x39506967;
            auVar268._28_4_ = 0x39506967;
            auVar84._8_4_ = 0x3ab743ce;
            auVar84._0_8_ = 0x3ab743ce3ab743ce;
            auVar84._12_4_ = 0x3ab743ce;
            auVar84._16_4_ = 0x3ab743ce;
            auVar84._20_4_ = 0x3ab743ce;
            auVar84._24_4_ = 0x3ab743ce;
            auVar84._28_4_ = 0x3ab743ce;
            auVar194 = vfmadd213ps_avx512vl(auVar268,auVar193,auVar84);
            auVar85._8_4_ = 0x3c088908;
            auVar85._0_8_ = 0x3c0889083c088908;
            auVar85._12_4_ = 0x3c088908;
            auVar85._16_4_ = 0x3c088908;
            auVar85._20_4_ = 0x3c088908;
            auVar85._24_4_ = 0x3c088908;
            auVar85._28_4_ = 0x3c088908;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar193,auVar85);
            auVar86._8_4_ = 0x3d2aa9c1;
            auVar86._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar86._12_4_ = 0x3d2aa9c1;
            auVar86._16_4_ = 0x3d2aa9c1;
            auVar86._20_4_ = 0x3d2aa9c1;
            auVar86._24_4_ = 0x3d2aa9c1;
            auVar86._28_4_ = 0x3d2aa9c1;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar193,auVar86);
            auVar87._8_4_ = 0x3e2aaaaa;
            auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar87._12_4_ = 0x3e2aaaaa;
            auVar87._16_4_ = 0x3e2aaaaa;
            auVar87._20_4_ = 0x3e2aaaaa;
            auVar87._24_4_ = 0x3e2aaaaa;
            auVar87._28_4_ = 0x3e2aaaaa;
            auVar194 = vfmadd213ps_avx512vl(auVar194,auVar193,auVar87);
            auVar162 = vfmadd213ps_fma(auVar194,auVar193,auVar276);
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar118,auVar193);
            auVar233._0_4_ = auVar162._0_4_ + 1.0;
            auVar233._4_4_ = auVar162._4_4_ + 1.0;
            auVar233._8_4_ = auVar162._8_4_ + 1.0;
            auVar233._12_4_ = auVar162._12_4_ + 1.0;
            auVar233._16_4_ = 0x3f800000;
            auVar233._20_4_ = 0x3f800000;
            auVar233._24_4_ = 0x3f800000;
            auVar233._28_4_ = 0x3f800000;
            auVar226._0_4_ = (int)auVar200._0_4_;
            auVar226._4_4_ = (int)auVar200._4_4_;
            auVar226._8_4_ = (int)auVar200._8_4_;
            auVar226._12_4_ = (int)auVar200._12_4_;
            auVar226._16_4_ = (int)auVar200._16_4_;
            auVar226._20_4_ = (int)auVar200._20_4_;
            auVar226._24_4_ = (int)auVar200._24_4_;
            auVar226._28_4_ = (int)auVar200._28_4_;
            auVar193 = vpslld_avx2(auVar226,0x17);
            auVar88._8_4_ = 0x3f800000;
            auVar88._0_8_ = 0x3f8000003f800000;
            auVar88._12_4_ = 0x3f800000;
            auVar88._16_4_ = 0x3f800000;
            auVar88._20_4_ = 0x3f800000;
            auVar88._24_4_ = 0x3f800000;
            auVar88._28_4_ = 0x3f800000;
            auVar193 = vpaddd_avx512vl(auVar193,auVar88);
            auVar162 = vfmadd213ps_fma(auVar193,auVar233,auVar284);
            auVar193 = vrcpps_avx(ZEXT1632(auVar162));
            auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar193,auVar284);
            auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar193,auVar193);
            auVar188 = ZEXT1632(auVar162);
            break;
          case 5:
            auVar288._8_4_ = 0x42b0c0a5;
            auVar288._0_8_ = 0x42b0c0a542b0c0a5;
            auVar288._12_4_ = 0x42b0c0a5;
            auVar288._16_4_ = 0x42b0c0a5;
            auVar288._20_4_ = 0x42b0c0a5;
            auVar288._24_4_ = 0x42b0c0a5;
            auVar288._28_4_ = 0x42b0c0a5;
            auVar193 = vminps_avx(auVar188,auVar288);
            auVar294._8_4_ = 0xc2b0c0a5;
            auVar294._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar294._12_4_ = 0xc2b0c0a5;
            auVar294._16_4_ = 0xc2b0c0a5;
            auVar294._20_4_ = 0xc2b0c0a5;
            auVar294._24_4_ = 0xc2b0c0a5;
            auVar294._28_4_ = 0xc2b0c0a5;
            auVar193 = vmaxps_avx(auVar193,auVar294);
            auVar305._8_4_ = 0x3fb8aa3b;
            auVar305._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar305._12_4_ = 0x3fb8aa3b;
            auVar305._16_4_ = 0x3fb8aa3b;
            auVar305._20_4_ = 0x3fb8aa3b;
            auVar305._24_4_ = 0x3fb8aa3b;
            auVar305._28_4_ = 0x3fb8aa3b;
            auVar299._8_4_ = 0x3f000000;
            auVar299._0_8_ = 0x3f0000003f000000;
            auVar299._12_4_ = 0x3f000000;
            auVar299._16_4_ = 0x3f000000;
            auVar299._20_4_ = 0x3f000000;
            auVar299._24_4_ = 0x3f000000;
            auVar299._28_4_ = 0x3f000000;
            auVar162 = vfmadd213ps_fma(auVar305,auVar193,auVar299);
            auVar194 = vroundps_avx(ZEXT1632(auVar162),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar194,1);
            auVar310._8_4_ = 0x3f800000;
            auVar310._0_8_ = 0x3f8000003f800000;
            auVar310._12_4_ = 0x3f800000;
            auVar310._16_4_ = 0x3f800000;
            auVar310._20_4_ = 0x3f800000;
            auVar310._24_4_ = 0x3f800000;
            auVar310._28_4_ = 0x3f800000;
            auVar189 = vsubps_avx512vl(auVar194,auVar310);
            bVar13 = (bool)((byte)uVar136 & 1);
            auVar195._0_4_ = (float)((uint)bVar13 * auVar189._0_4_ | (uint)!bVar13 * auVar194._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar195._4_4_ = (float)((uint)bVar13 * auVar189._4_4_ | (uint)!bVar13 * auVar194._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar195._8_4_ = (float)((uint)bVar13 * auVar189._8_4_ | (uint)!bVar13 * auVar194._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar195._12_4_ =
                 (float)((uint)bVar13 * auVar189._12_4_ | (uint)!bVar13 * auVar194._12_4_);
            bVar13 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar195._16_4_ =
                 (float)((uint)bVar13 * auVar189._16_4_ | (uint)!bVar13 * auVar194._16_4_);
            bVar13 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar195._20_4_ =
                 (float)((uint)bVar13 * auVar189._20_4_ | (uint)!bVar13 * auVar194._20_4_);
            bVar13 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar195._24_4_ =
                 (float)((uint)bVar13 * auVar189._24_4_ | (uint)!bVar13 * auVar194._24_4_);
            bVar13 = SUB81(uVar136 >> 7,0);
            auVar195._28_4_ =
                 (float)((uint)bVar13 * auVar189._28_4_ | (uint)!bVar13 * auVar194._28_4_);
            auVar315._8_4_ = 0x3f318000;
            auVar315._0_8_ = 0x3f3180003f318000;
            auVar315._12_4_ = 0x3f318000;
            auVar315._16_4_ = 0x3f318000;
            auVar315._20_4_ = 0x3f318000;
            auVar315._24_4_ = 0x3f318000;
            auVar315._28_4_ = 0x3f318000;
            auVar162 = vfmsub231ps_fma(auVar193,auVar195,auVar315);
            auVar189 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar193 = vfnmsub231ps_avx512vl(ZEXT1632(auVar162),auVar195,auVar189);
            auVar247._0_4_ = auVar193._0_4_ * auVar193._0_4_;
            auVar247._4_4_ = auVar193._4_4_ * auVar193._4_4_;
            auVar247._8_4_ = auVar193._8_4_ * auVar193._8_4_;
            auVar247._12_4_ = auVar193._12_4_ * auVar193._12_4_;
            auVar247._16_4_ = auVar193._16_4_ * auVar193._16_4_;
            auVar247._20_4_ = auVar193._20_4_ * auVar193._20_4_;
            auVar247._24_4_ = auVar193._24_4_ * auVar193._24_4_;
            auVar247._28_4_ = 0;
            auVar320._8_4_ = 0x39506967;
            auVar320._0_8_ = 0x3950696739506967;
            auVar320._12_4_ = 0x39506967;
            auVar320._16_4_ = 0x39506967;
            auVar320._20_4_ = 0x39506967;
            auVar320._24_4_ = 0x39506967;
            auVar320._28_4_ = 0x39506967;
            auVar326._8_4_ = 0x3ab743ce;
            auVar326._0_8_ = 0x3ab743ce3ab743ce;
            auVar326._12_4_ = 0x3ab743ce;
            auVar326._16_4_ = 0x3ab743ce;
            auVar326._20_4_ = 0x3ab743ce;
            auVar326._24_4_ = 0x3ab743ce;
            auVar326._28_4_ = 0x3ab743ce;
            auVar162 = vfmadd213ps_fma(auVar320,auVar193,auVar326);
            auVar330._8_4_ = 0x3c088908;
            auVar330._0_8_ = 0x3c0889083c088908;
            auVar330._12_4_ = 0x3c088908;
            auVar330._16_4_ = 0x3c088908;
            auVar330._20_4_ = 0x3c088908;
            auVar330._24_4_ = 0x3c088908;
            auVar330._28_4_ = 0x3c088908;
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar193,auVar330);
            auVar334._8_4_ = 0x3d2aa9c1;
            auVar334._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar334._12_4_ = 0x3d2aa9c1;
            auVar334._16_4_ = 0x3d2aa9c1;
            auVar334._20_4_ = 0x3d2aa9c1;
            auVar334._24_4_ = 0x3d2aa9c1;
            auVar334._28_4_ = 0x3d2aa9c1;
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar193,auVar334);
            auVar190 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar194 = vfmadd213ps_avx512vl(ZEXT1632(auVar162),auVar193,auVar190);
            auVar162 = vfmadd213ps_fma(auVar194,auVar193,auVar299);
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar247,auVar193);
            auVar231._0_4_ = auVar162._0_4_ + 1.0;
            auVar231._4_4_ = auVar162._4_4_ + 1.0;
            auVar231._8_4_ = auVar162._8_4_ + 1.0;
            auVar231._12_4_ = auVar162._12_4_ + 1.0;
            auVar231._16_4_ = 0x3f800000;
            auVar231._20_4_ = 0x3f800000;
            auVar231._24_4_ = 0x3f800000;
            auVar231._28_4_ = 0x3f800000;
            auVar248._0_4_ = (int)auVar195._0_4_;
            auVar248._4_4_ = (int)auVar195._4_4_;
            auVar248._8_4_ = (int)auVar195._8_4_;
            auVar248._12_4_ = (int)auVar195._12_4_;
            auVar248._16_4_ = (int)auVar195._16_4_;
            auVar248._20_4_ = (int)auVar195._20_4_;
            auVar248._24_4_ = (int)auVar195._24_4_;
            auVar248._28_4_ = (int)auVar195._28_4_;
            auVar193 = vpslld_avx2(auVar248,0x17);
            auVar191 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar193 = vpaddd_avx512vl(auVar193,auVar191);
            auVar162 = vfmadd213ps_fma(auVar193,auVar231,auVar310);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar162),_DAT_00557200,2);
            auVar192._8_4_ = 0x800000;
            auVar192._0_8_ = 0x80000000800000;
            auVar192._12_4_ = 0x800000;
            auVar192._16_4_ = 0x800000;
            auVar192._20_4_ = 0x800000;
            auVar192._24_4_ = 0x800000;
            auVar192._28_4_ = 0x800000;
            auVar193 = vmaxps_avx512vl(ZEXT1632(auVar162),auVar192);
            auVar249 = vpsrld_avx2(auVar193,0x17);
            auVar267._8_4_ = 0x807fffff;
            auVar267._0_8_ = 0x807fffff807fffff;
            auVar267._12_4_ = 0x807fffff;
            auVar267._16_4_ = 0x807fffff;
            auVar267._20_4_ = 0x807fffff;
            auVar267._24_4_ = 0x807fffff;
            auVar267._28_4_ = 0x807fffff;
            auVar201._8_4_ = 0x3f000000;
            auVar201._0_8_ = 0x3f0000003f000000;
            auVar201._12_4_ = 0x3f000000;
            auVar201._16_4_ = 0x3f000000;
            auVar201._20_4_ = 0x3f000000;
            auVar201._24_4_ = 0x3f000000;
            auVar201._28_4_ = 0x3f000000;
            auVar193 = vpternlogd_avx512vl(auVar193,auVar267,auVar201,0xea);
            auVar68._8_4_ = 0x3f3504f3;
            auVar68._0_8_ = 0x3f3504f33f3504f3;
            auVar68._12_4_ = 0x3f3504f3;
            auVar68._16_4_ = 0x3f3504f3;
            auVar68._20_4_ = 0x3f3504f3;
            auVar68._24_4_ = 0x3f3504f3;
            auVar68._28_4_ = 0x3f3504f3;
            uVar15 = vcmpps_avx512vl(auVar193,auVar68,1);
            auVar192 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar194 = vaddps_avx512vl(auVar193,auVar192);
            auVar201 = vaddps_avx512vl(auVar194,auVar193);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar196._0_4_ = (float)((uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar194._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar196._4_4_ = (float)((uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar194._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar196._8_4_ = (float)((uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar194._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar196._12_4_ =
                 (float)((uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar194._12_4_);
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar196._16_4_ =
                 (float)((uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar194._16_4_);
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar196._20_4_ =
                 (float)((uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar194._20_4_);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar196._24_4_ =
                 (float)((uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar194._24_4_);
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar196._28_4_ = (uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar194._28_4_;
            auVar116._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar116._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar116._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar116._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar116._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar116._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar116._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar116._28_4_ = auVar193._28_4_;
            auVar275._8_4_ = 0x3d9021bb;
            auVar275._0_8_ = 0x3d9021bb3d9021bb;
            auVar275._12_4_ = 0x3d9021bb;
            auVar275._16_4_ = 0x3d9021bb;
            auVar275._20_4_ = 0x3d9021bb;
            auVar275._24_4_ = 0x3d9021bb;
            auVar275._28_4_ = 0x3d9021bb;
            auVar69._8_4_ = 0xbdebd1b8;
            auVar69._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar69._12_4_ = 0xbdebd1b8;
            auVar69._16_4_ = 0xbdebd1b8;
            auVar69._20_4_ = 0xbdebd1b8;
            auVar69._24_4_ = 0xbdebd1b8;
            auVar69._28_4_ = 0xbdebd1b8;
            auVar193 = vfmadd213ps_avx512vl(auVar275,auVar196,auVar69);
            auVar70._8_4_ = 0x3def251a;
            auVar70._0_8_ = 0x3def251a3def251a;
            auVar70._12_4_ = 0x3def251a;
            auVar70._16_4_ = 0x3def251a;
            auVar70._20_4_ = 0x3def251a;
            auVar70._24_4_ = 0x3def251a;
            auVar70._28_4_ = 0x3def251a;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar70);
            auVar71._8_4_ = 0xbdfe5d4f;
            auVar71._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar71._12_4_ = 0xbdfe5d4f;
            auVar71._16_4_ = 0xbdfe5d4f;
            auVar71._20_4_ = 0xbdfe5d4f;
            auVar71._24_4_ = 0xbdfe5d4f;
            auVar71._28_4_ = 0xbdfe5d4f;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar71);
            auVar72._8_4_ = 0x3e11e9bf;
            auVar72._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar72._12_4_ = 0x3e11e9bf;
            auVar72._16_4_ = 0x3e11e9bf;
            auVar72._20_4_ = 0x3e11e9bf;
            auVar72._24_4_ = 0x3e11e9bf;
            auVar72._28_4_ = 0x3e11e9bf;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar72);
            auVar73._8_4_ = 0xbe2aae50;
            auVar73._0_8_ = 0xbe2aae50be2aae50;
            auVar73._12_4_ = 0xbe2aae50;
            auVar73._16_4_ = 0xbe2aae50;
            auVar73._20_4_ = 0xbe2aae50;
            auVar73._24_4_ = 0xbe2aae50;
            auVar73._28_4_ = 0xbe2aae50;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar73);
            auVar74._8_4_ = 0x3e4cceac;
            auVar74._0_8_ = 0x3e4cceac3e4cceac;
            auVar74._12_4_ = 0x3e4cceac;
            auVar74._16_4_ = 0x3e4cceac;
            auVar74._20_4_ = 0x3e4cceac;
            auVar74._24_4_ = 0x3e4cceac;
            auVar74._28_4_ = 0x3e4cceac;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar74);
            auVar75._8_4_ = 0xbe7ffffc;
            auVar75._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar75._12_4_ = 0xbe7ffffc;
            auVar75._16_4_ = 0xbe7ffffc;
            auVar75._20_4_ = 0xbe7ffffc;
            auVar75._24_4_ = 0xbe7ffffc;
            auVar75._28_4_ = 0xbe7ffffc;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar75);
            auVar76._8_4_ = 0x3eaaaaaa;
            auVar76._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar76._12_4_ = 0x3eaaaaaa;
            auVar76._16_4_ = 0x3eaaaaaa;
            auVar76._20_4_ = 0x3eaaaaaa;
            auVar76._24_4_ = 0x3eaaaaaa;
            auVar76._28_4_ = 0x3eaaaaaa;
            auVar193 = vfmadd213ps_avx512vl(auVar193,auVar196,auVar76);
            auVar117._4_4_ = auVar196._4_4_ * auVar196._4_4_ * auVar196._4_4_ * auVar193._4_4_;
            auVar117._0_4_ = auVar196._0_4_ * auVar196._0_4_ * auVar196._0_4_ * auVar193._0_4_;
            auVar117._8_4_ = auVar196._8_4_ * auVar196._8_4_ * auVar196._8_4_ * auVar193._8_4_;
            auVar117._12_4_ = auVar196._12_4_ * auVar196._12_4_ * auVar196._12_4_ * auVar193._12_4_;
            auVar117._16_4_ = auVar196._16_4_ * auVar196._16_4_ * auVar196._16_4_ * auVar193._16_4_;
            auVar117._20_4_ = auVar196._20_4_ * auVar196._20_4_ * auVar196._20_4_ * auVar193._20_4_;
            auVar117._24_4_ = auVar196._24_4_ * auVar196._24_4_ * auVar196._24_4_ * auVar193._24_4_;
            auVar117._28_4_ = auVar193._28_4_;
            auVar77._8_4_ = 0xffffff82;
            auVar77._0_8_ = 0xffffff82ffffff82;
            auVar77._12_4_ = 0xffffff82;
            auVar77._16_4_ = 0xffffff82;
            auVar77._20_4_ = 0xffffff82;
            auVar77._24_4_ = 0xffffff82;
            auVar77._28_4_ = 0xffffff82;
            auVar193 = vpaddd_avx512vl(auVar249,auVar77);
            auVar193 = vcvtdq2ps_avx(auVar193);
            auVar194 = vsubps_avx512vl(auVar193,auVar310);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar197._0_4_ = (uint)bVar13 * auVar194._0_4_ | (uint)!bVar13 * auVar193._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar197._4_4_ = (uint)bVar13 * auVar194._4_4_ | (uint)!bVar13 * auVar193._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar197._8_4_ = (uint)bVar13 * auVar194._8_4_ | (uint)!bVar13 * auVar193._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar197._12_4_ = (uint)bVar13 * auVar194._12_4_ | (uint)!bVar13 * auVar193._12_4_;
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar197._16_4_ = (uint)bVar13 * auVar194._16_4_ | (uint)!bVar13 * auVar193._16_4_;
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar197._20_4_ = (uint)bVar13 * auVar194._20_4_ | (uint)!bVar13 * auVar193._20_4_;
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar197._24_4_ = (uint)bVar13 * auVar194._24_4_ | (uint)!bVar13 * auVar193._24_4_;
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar197._28_4_ = (uint)bVar13 * auVar194._28_4_ | (uint)!bVar13 * auVar193._28_4_;
            auVar193 = vfmadd231ps_avx512vl(auVar117,auVar197,auVar189);
            auVar162 = vfmsub231ps_fma(auVar193,auVar299,auVar116);
            auVar193 = vsubps_avx(ZEXT1632(auVar162),auVar196);
            auVar162 = vfmsub231ps_fma(auVar193,auVar315,auVar197);
            auVar283._8_4_ = 0xc0000000;
            auVar283._0_8_ = 0xc0000000c0000000;
            auVar283._12_4_ = 0xc0000000;
            auVar283._16_4_ = 0xc0000000;
            auVar283._20_4_ = 0xc0000000;
            auVar283._24_4_ = 0xc0000000;
            auVar283._28_4_ = 0xc0000000;
            auVar193 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar136 & 1);
            auVar198._0_4_ =
                 (uint)bVar13 * auVar193._0_4_ | (uint)!bVar13 * (int)(auVar162._0_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar198._4_4_ =
                 (uint)bVar13 * auVar193._4_4_ | (uint)!bVar13 * (int)(auVar162._4_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar198._8_4_ =
                 (uint)bVar13 * auVar193._8_4_ | (uint)!bVar13 * (int)(auVar162._8_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar198._12_4_ =
                 (uint)bVar13 * auVar193._12_4_ | (uint)!bVar13 * (int)(auVar162._12_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar198._16_4_ = (uint)bVar13 * auVar193._16_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar198._20_4_ = (uint)bVar13 * auVar193._20_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar198._24_4_ = (uint)bVar13 * auVar193._24_4_ | (uint)!bVar13 * -0x80000000;
            auVar198._28_4_ = (uint)(byte)(uVar136 >> 7) * auVar193._28_4_;
            auVar193 = vminps_avx(auVar198,auVar288);
            auVar193 = vmaxps_avx(auVar193,auVar294);
            auVar162 = vfmadd213ps_fma(auVar305,auVar193,auVar299);
            auVar194 = vroundps_avx(ZEXT1632(auVar162),1);
            uVar136 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar194,1);
            auVar201 = vsubps_avx512vl(auVar194,auVar310);
            bVar13 = (bool)((byte)uVar136 & 1);
            auVar199._0_4_ = (float)((uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar194._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
            auVar199._4_4_ = (float)((uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar194._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
            auVar199._8_4_ = (float)((uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar194._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
            auVar199._12_4_ =
                 (float)((uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar194._12_4_);
            bVar13 = (bool)((byte)(uVar136 >> 4) & 1);
            auVar199._16_4_ =
                 (float)((uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar194._16_4_);
            bVar13 = (bool)((byte)(uVar136 >> 5) & 1);
            auVar199._20_4_ =
                 (float)((uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar194._20_4_);
            bVar13 = (bool)((byte)(uVar136 >> 6) & 1);
            auVar199._24_4_ =
                 (float)((uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar194._24_4_);
            bVar13 = SUB81(uVar136 >> 7,0);
            auVar199._28_4_ =
                 (float)((uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar194._28_4_);
            auVar162 = vfmsub231ps_fma(auVar193,auVar199,auVar315);
            auVar193 = vfnmsub231ps_avx512vl(ZEXT1632(auVar162),auVar199,auVar189);
            auVar250._0_4_ = auVar193._0_4_ * auVar193._0_4_;
            auVar250._4_4_ = auVar193._4_4_ * auVar193._4_4_;
            auVar250._8_4_ = auVar193._8_4_ * auVar193._8_4_;
            auVar250._12_4_ = auVar193._12_4_ * auVar193._12_4_;
            auVar250._16_4_ = auVar193._16_4_ * auVar193._16_4_;
            auVar250._20_4_ = auVar193._20_4_ * auVar193._20_4_;
            auVar250._24_4_ = auVar193._24_4_ * auVar193._24_4_;
            auVar250._28_4_ = 0;
            auVar162 = vfmadd213ps_fma(auVar320,auVar193,auVar326);
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar193,auVar330);
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar193,auVar334);
            auVar194 = vfmadd213ps_avx512vl(ZEXT1632(auVar162),auVar193,auVar190);
            auVar162 = vfmadd213ps_fma(auVar194,auVar193,auVar299);
            auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar250,auVar193);
            auVar232._0_4_ = auVar162._0_4_ + 1.0;
            auVar232._4_4_ = auVar162._4_4_ + 1.0;
            auVar232._8_4_ = auVar162._8_4_ + 1.0;
            auVar232._12_4_ = auVar162._12_4_ + 1.0;
            auVar232._16_4_ = 0x3f800000;
            auVar232._20_4_ = 0x3f800000;
            auVar232._24_4_ = 0x3f800000;
            auVar232._28_4_ = 0x3f800000;
            auVar251._0_4_ = (int)auVar199._0_4_;
            auVar251._4_4_ = (int)auVar199._4_4_;
            auVar251._8_4_ = (int)auVar199._8_4_;
            auVar251._12_4_ = (int)auVar199._12_4_;
            auVar251._16_4_ = (int)auVar199._16_4_;
            auVar251._20_4_ = (int)auVar199._20_4_;
            auVar251._24_4_ = (int)auVar199._24_4_;
            auVar251._28_4_ = (int)auVar199._28_4_;
            auVar193 = vpslld_avx2(auVar251,0x17);
            auVar193 = vpaddd_avx512vl(auVar193,auVar191);
            auVar162 = vfmadd213ps_fma(auVar193,auVar232,auVar310);
            auVar193 = vrcpps_avx(ZEXT1632(auVar162));
            auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar193,auVar310);
            auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar193,auVar193);
            auVar193 = vfnmadd213ps_avx512vl(ZEXT1632(auVar162),auVar283,auVar192);
            auVar188._4_4_ = auVar193._4_4_ * auVar188._4_4_;
            auVar188._0_4_ = auVar193._0_4_ * auVar188._0_4_;
            auVar188._8_4_ = auVar193._8_4_ * auVar188._8_4_;
            auVar188._12_4_ = auVar193._12_4_ * auVar188._12_4_;
            auVar188._16_4_ = auVar193._16_4_ * auVar188._16_4_;
            auVar188._20_4_ = auVar193._20_4_ * auVar188._20_4_;
            auVar188._24_4_ = auVar193._24_4_ * auVar188._24_4_;
            break;
          case 6:
            uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
            auVar191._4_4_ = uVar1;
            auVar191._0_4_ = uVar1;
            auVar191._8_4_ = uVar1;
            auVar191._12_4_ = uVar1;
            auVar191._16_4_ = uVar1;
            auVar191._20_4_ = uVar1;
            auVar191._24_4_ = uVar1;
            auVar191._28_4_ = uVar1;
            uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
            auVar189._4_4_ = uVar1;
            auVar189._0_4_ = uVar1;
            auVar189._8_4_ = uVar1;
            auVar189._12_4_ = uVar1;
            auVar189._16_4_ = uVar1;
            auVar189._20_4_ = uVar1;
            auVar189._24_4_ = uVar1;
            auVar189._28_4_ = uVar1;
            auVar193 = vfmadd213ps_avx512vl(auVar191,auVar188,auVar189);
            auVar193 = vmaxps_avx(auVar193,_DAT_00557200);
            auVar190._8_4_ = 0x3f800000;
            auVar190._0_8_ = 0x3f8000003f800000;
            auVar190._12_4_ = 0x3f800000;
            auVar190._16_4_ = 0x3f800000;
            auVar190._20_4_ = 0x3f800000;
            auVar190._24_4_ = 0x3f800000;
            auVar190._28_4_ = 0x3f800000;
            auVar193 = vminps_avx512vl(auVar193,auVar190);
            auVar188._4_4_ = auVar193._4_4_ * auVar188._4_4_;
            auVar188._0_4_ = auVar193._0_4_ * auVar188._0_4_;
            auVar188._8_4_ = auVar193._8_4_ * auVar188._8_4_;
            auVar188._12_4_ = auVar193._12_4_ * auVar188._12_4_;
            auVar188._16_4_ = auVar193._16_4_ * auVar188._16_4_;
            auVar188._20_4_ = auVar193._20_4_ * auVar188._20_4_;
            auVar188._24_4_ = auVar193._24_4_ * auVar188._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar157 * 0x20) = auVar188;
          uVar157 = uVar157 + 1;
          lVar146 = lVar146 + 8;
          lVar142 = lVar142 + 8;
          lVar143 = lVar143 + 8;
          lVar147 = lVar147 + 8;
          lVar149 = lVar149 + 8;
          lVar138 = lVar138 + 8;
          lVar160 = lVar160 + 8;
          local_358 = local_358 + 8;
        } while (uVar157 != local_220);
      }
      auVar163 = local_278;
      auVar162 = local_2b8;
      local_238 = (ulong)(int)uVar133;
      uVar157 = local_238 & 0xfffffffffffffff8;
      uVar148 = uVar133 >> 2 & 1;
      local_2b8._4_4_ = 0;
      local_2b8._0_4_ = uVar148;
      if ((uVar133 >> 2 & 1) != 0) {
        if (lVar10 == 0) {
          auVar164 = ZEXT816(0) << 0x40;
        }
        else {
          auVar164 = *(undefined1 (*) [16])(lVar10 + uVar157 * 4);
        }
        lVar146 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar11 = (this->weight_data_tm).data;
        pauVar140 = (undefined1 (*) [16])(lVar146 * uVar157 + (long)pvVar11);
        pauVar161 = (undefined1 (*) [16])((uVar157 | 1) * lVar146 + (long)pvVar11);
        pauVar158 = (undefined1 (*) [16])((uVar157 | 2) * lVar146 + (long)pvVar11);
        pauVar159 = (undefined1 (*) [16])(lVar146 * (uVar157 | 3) + (long)pvVar11);
        pauVar141 = local_308;
        if ((int)uVar134 < 8) {
          uVar148 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar148 = uVar134 & 0xfffffff8;
          auVar301 = ZEXT864(0);
          iVar145 = 7;
          auVar296 = ZEXT864(0);
          auVar302 = ZEXT864(0);
          auVar290 = ZEXT864(0);
          do {
            auVar193 = *pauVar141;
            auVar165 = vlddqu_avx(*pauVar140);
            auVar194 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar161);
            auVar188 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar158);
            auVar189 = vcvtph2ps_f16c(auVar165);
            auVar165 = vlddqu_avx(*pauVar159);
            auVar190 = vcvtph2ps_f16c(auVar165);
            auVar165 = vfmadd231ps_fma(auVar290._0_32_,auVar193,auVar194);
            auVar290 = ZEXT1664(auVar165);
            local_1b8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar302._0_32_,auVar193,auVar188);
            auVar302 = ZEXT1664(auVar165);
            local_1f8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar296._0_32_,auVar193,auVar189);
            auVar296 = ZEXT1664(auVar165);
            local_1d8 = ZEXT1632(auVar165);
            auVar165 = vfmadd231ps_fma(auVar301._0_32_,auVar193,auVar190);
            auVar301 = ZEXT1664(auVar165);
            local_198 = ZEXT1632(auVar165);
            pauVar141 = pauVar141 + 1;
            pauVar140 = pauVar140 + 1;
            pauVar161 = pauVar161 + 1;
            pauVar158 = pauVar158 + 1;
            pauVar159 = pauVar159 + 1;
            iVar145 = iVar145 + 8;
          } while (iVar145 < (int)uVar134);
        }
        auVar165 = ZEXT816(0) << 0x40;
        local_2a8 = (float)uVar157;
        uStack_2a4 = (undefined4)(uVar157 >> 0x20);
        local_2b8._8_8_ = auVar162._8_8_;
        if ((int)(uVar148 | 3) < (int)uVar134) {
          auVar301 = ZEXT864(0);
          lVar146 = 0;
          auVar290 = ZEXT864(0);
          auVar162 = ZEXT816(0);
          pauVar144 = pauVar141;
          uVar132 = uVar148;
          do {
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(*pauVar140 + lVar146);
            auVar166 = vcvtph2ps_f16c(auVar166);
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(*pauVar161 + lVar146);
            auVar223 = vcvtph2ps_f16c(auVar167);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(*pauVar158 + lVar146);
            auVar168 = vcvtph2ps_f16c(auVar168);
            auVar167 = *(undefined1 (*) [16])(*pauVar141 + lVar146 * 2);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = *(ulong *)(*pauVar159 + lVar146);
            auVar169 = vcvtph2ps_f16c(auVar169);
            auVar165 = vfmadd231ps_fma(auVar165,auVar167,auVar166);
            auVar162 = vfmadd231ps_fma(auVar162,auVar167,auVar223);
            auVar166 = vfmadd231ps_fma(auVar290._0_16_,auVar167,auVar168);
            auVar290 = ZEXT1664(auVar166);
            auVar167 = vfmadd231ps_fma(auVar301._0_16_,auVar167,auVar169);
            auVar301 = ZEXT1664(auVar167);
            pauVar144 = (undefined1 (*) [32])(*pauVar144 + 0x10);
            uVar148 = uVar132 + 4;
            iVar145 = uVar132 + 7;
            lVar146 = lVar146 + 8;
            uVar132 = uVar148;
          } while (iVar145 < (int)uVar134);
          pauVar159 = (undefined1 (*) [16])(*pauVar159 + lVar146);
          pauVar158 = (undefined1 (*) [16])(*pauVar158 + lVar146);
          pauVar161 = (undefined1 (*) [16])(*pauVar161 + lVar146);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + lVar146);
          pauVar141 = pauVar144;
        }
        else {
          auVar162 = ZEXT816(0);
          auVar166 = SUB6416(ZEXT864(0),0);
          auVar167 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar134 - uVar148;
        local_278._8_8_ = auVar163._8_8_;
        if (uVar134 - uVar148 != 0 && (int)uVar148 <= (int)uVar134) {
          lVar146 = 0;
          do {
            local_298._0_16_ = auVar164;
            uVar148 = *(uint *)(*pauVar141 + lVar146 * 4);
            fVar255 = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar146 * 2));
            auVar193 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar255;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar193._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            uVar132 = *(uint *)(*pauVar141 + lVar146 * 4);
            fVar255 = float16_to_float32(*(unsigned_short *)(*pauVar161 + lVar146 * 2));
            local_248 = ZEXT416(*(uint *)(*pauVar141 + lVar146 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar158 + lVar146 * 2));
            local_258._4_4_ = extraout_XMM0_Db_07;
            local_258._8_4_ = extraout_XMM0_Dc_06;
            local_258._12_4_ = extraout_XMM0_Dd_06;
            local_268 = ZEXT416(*(uint *)(*pauVar141 + lVar146 * 4));
            auVar290._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar159 + lVar146 * 2));
            auVar290._4_60_ = extraout_var_00;
            auVar163 = vinsertps_avx(_local_218,ZEXT416((uint)fVar255),0x10);
            auVar163 = vinsertps_avx(auVar163,ZEXT416((uint)local_258._0_4_),0x20);
            auVar163 = vinsertps_avx(auVar163,auVar290._0_16_,0x30);
            auVar164 = vinsertps_avx(ZEXT416(uVar148),ZEXT416(uVar132),0x10);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_248._0_4_),0x20);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_268._0_4_),0x30);
            auVar164 = vfmadd231ps_fma(local_298._0_16_,auVar163,auVar164);
            lVar146 = lVar146 + 1;
          } while (local_278._0_4_ != (int)lVar146);
        }
        auVar193 = vhaddps_avx(local_1b8,local_1f8);
        auVar194 = vhaddps_avx(local_1d8,local_198);
        auVar193 = vhaddps_avx(auVar193,auVar194);
        auVar168 = vunpcklps_avx(auVar165,auVar162);
        auVar169 = vunpcklps_avx(auVar166,auVar167);
        auVar163 = vunpckhps_avx(auVar165,auVar162);
        auVar167 = vunpckhps_avx(auVar166,auVar167);
        auVar162 = vmovlhps_avx(auVar168,auVar169);
        auVar166 = vunpckhpd_avx(auVar168,auVar169);
        auVar165 = vmovlhps_avx(auVar163,auVar167);
        auVar167 = vunpckhpd_avx(auVar163,auVar167);
        auVar163._0_4_ =
             auVar166._0_4_ + auVar162._0_4_ + auVar165._0_4_ + auVar167._0_4_ +
             auVar164._0_4_ + auVar193._0_4_ + auVar193._16_4_;
        auVar163._4_4_ =
             auVar166._4_4_ + auVar162._4_4_ + auVar165._4_4_ + auVar167._4_4_ +
             auVar164._4_4_ + auVar193._4_4_ + auVar193._20_4_;
        auVar163._8_4_ =
             auVar166._8_4_ + auVar162._8_4_ + auVar165._8_4_ + auVar167._8_4_ +
             auVar164._8_4_ + auVar193._8_4_ + auVar193._24_4_;
        auVar163._12_4_ =
             auVar166._12_4_ + auVar162._12_4_ + auVar165._12_4_ + auVar167._12_4_ +
             auVar164._12_4_ + auVar193._12_4_ + auVar193._28_4_;
        uVar148 = local_2b8._0_4_;
        switch(iVar7) {
        case 1:
          auVar163 = vmaxps_avx(auVar163,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar162 = vmaxps_avx(auVar163,ZEXT816(0) << 0x20);
          auVar163 = vminps_avx(auVar163,ZEXT816(0) << 0x20);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar56._4_4_ = uVar1;
          auVar56._0_4_ = uVar1;
          auVar56._8_4_ = uVar1;
          auVar56._12_4_ = uVar1;
          auVar163 = vfmadd132ps_avx512vl(auVar163,auVar162,auVar56);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar162 = vmaxps_avx512vl(auVar163,auVar54);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar163 = vminps_avx512vl(auVar162,auVar55);
          break;
        case 4:
          auVar44._8_4_ = 0x80000000;
          auVar44._0_8_ = 0x8000000080000000;
          auVar44._12_4_ = 0x80000000;
          auVar162 = vxorps_avx512vl(auVar163,auVar44);
          auVar45._8_4_ = 0x42b0c0a5;
          auVar45._0_8_ = 0x42b0c0a542b0c0a5;
          auVar45._12_4_ = 0x42b0c0a5;
          auVar162 = vminps_avx512vl(auVar162,auVar45);
          auVar46._8_4_ = 0xc2b0c0a5;
          auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar46._12_4_ = 0xc2b0c0a5;
          auVar164 = vmaxps_avx512vl(auVar162,auVar46);
          auVar229._8_4_ = 0x3f000000;
          auVar229._0_8_ = 0x3f0000003f000000;
          auVar229._12_4_ = 0x3f000000;
          auVar244._8_4_ = 0x3fb8aa3b;
          auVar244._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar244._12_4_ = 0x3fb8aa3b;
          auVar163 = vfmadd213ps_fma(auVar244,auVar164,auVar229);
          auVar266._0_4_ = (int)auVar163._0_4_;
          auVar266._4_4_ = (int)auVar163._4_4_;
          auVar266._8_4_ = (int)auVar163._8_4_;
          auVar266._12_4_ = (int)auVar163._12_4_;
          auVar162 = vcvtdq2ps_avx(auVar266);
          auVar274._8_4_ = 0x3f800000;
          auVar274._0_8_ = 0x3f8000003f800000;
          auVar274._12_4_ = 0x3f800000;
          uVar157 = vcmpps_avx512vl(auVar163,auVar162,1);
          auVar163 = vsubps_avx512vl(auVar162,auVar274);
          bVar13 = (bool)((byte)uVar157 & 1);
          auVar187._0_4_ = (float)((uint)bVar13 * auVar163._0_4_ | (uint)!bVar13 * auVar162._0_4_);
          bVar13 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar187._4_4_ = (float)((uint)bVar13 * auVar163._4_4_ | (uint)!bVar13 * auVar162._4_4_);
          bVar13 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar187._8_4_ = (float)((uint)bVar13 * auVar163._8_4_ | (uint)!bVar13 * auVar162._8_4_);
          bVar13 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar187._12_4_ =
               (float)((uint)bVar13 * auVar163._12_4_ | (uint)!bVar13 * auVar162._12_4_);
          auVar47._8_4_ = 0x3f318000;
          auVar47._0_8_ = 0x3f3180003f318000;
          auVar47._12_4_ = 0x3f318000;
          auVar162 = vfmsub231ps_avx512vl(auVar164,auVar187,auVar47);
          auVar48._8_4_ = 0x395e8083;
          auVar48._0_8_ = 0x395e8083395e8083;
          auVar48._12_4_ = 0x395e8083;
          auVar163 = vfmsub231ps_avx512vl(auVar162,auVar187,auVar48);
          auVar245._8_4_ = 0x39506967;
          auVar245._0_8_ = 0x3950696739506967;
          auVar245._12_4_ = 0x39506967;
          auVar49._8_4_ = 0x3ab743ce;
          auVar49._0_8_ = 0x3ab743ce3ab743ce;
          auVar49._12_4_ = 0x3ab743ce;
          auVar162 = vfmadd213ps_avx512vl(auVar245,auVar163,auVar49);
          auVar50._8_4_ = 0x3c088908;
          auVar50._0_8_ = 0x3c0889083c088908;
          auVar50._12_4_ = 0x3c088908;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar50);
          auVar51._8_4_ = 0x3d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._12_4_ = 0x3d2aa9c1;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar51);
          auVar52._8_4_ = 0x3e2aaaaa;
          auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar52._12_4_ = 0x3e2aaaaa;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar163,auVar52);
          auVar282._0_4_ = auVar163._0_4_ * auVar163._0_4_;
          auVar282._4_4_ = auVar163._4_4_ * auVar163._4_4_;
          auVar282._8_4_ = auVar163._8_4_ * auVar163._8_4_;
          auVar282._12_4_ = auVar163._12_4_ * auVar163._12_4_;
          auVar162 = vfmadd213ps_fma(auVar162,auVar163,auVar229);
          auVar162 = vfmadd213ps_fma(auVar162,auVar282,auVar163);
          auVar230._0_4_ = auVar162._0_4_ + 1.0;
          auVar230._4_4_ = auVar162._4_4_ + 1.0;
          auVar230._8_4_ = auVar162._8_4_ + 1.0;
          auVar230._12_4_ = auVar162._12_4_ + 1.0;
          auVar224._0_4_ = (int)auVar187._0_4_;
          auVar224._4_4_ = (int)auVar187._4_4_;
          auVar224._8_4_ = (int)auVar187._8_4_;
          auVar224._12_4_ = (int)auVar187._12_4_;
          auVar162 = vpslld_avx(auVar224,0x17);
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          auVar162 = vpaddd_avx512vl(auVar162,auVar53);
          auVar163 = vfmadd213ps_fma(auVar162,auVar230,auVar274);
          auVar162 = vrcpps_avx(auVar163);
          auVar163 = vfmsub213ps_fma(auVar163,auVar162,auVar274);
          auVar163 = vfnmadd132ps_fma(auVar163,auVar162,auVar162);
          break;
        case 5:
          auVar287._8_4_ = 0x42b0c0a5;
          auVar287._0_8_ = 0x42b0c0a542b0c0a5;
          auVar287._12_4_ = 0x42b0c0a5;
          auVar162 = vminps_avx(auVar163,auVar287);
          auVar292._8_4_ = 0xc2b0c0a5;
          auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar292._12_4_ = 0xc2b0c0a5;
          auVar272._8_4_ = 0x3fb8aa3b;
          auVar272._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar272._12_4_ = 0x3fb8aa3b;
          auVar164 = vmaxps_avx(auVar162,auVar292);
          auVar241._8_4_ = 0x3f000000;
          auVar241._0_8_ = 0x3f0000003f000000;
          auVar241._12_4_ = 0x3f000000;
          auVar165 = vfmadd213ps_fma(auVar272,auVar164,auVar241);
          auVar263._0_4_ = (int)auVar165._0_4_;
          auVar263._4_4_ = (int)auVar165._4_4_;
          auVar263._8_4_ = (int)auVar165._8_4_;
          auVar263._12_4_ = (int)auVar165._12_4_;
          auVar162 = vcvtdq2ps_avx(auVar263);
          uVar157 = vcmpps_avx512vl(auVar165,auVar162,1);
          auVar228._8_4_ = 0x3f800000;
          auVar228._0_8_ = 0x3f8000003f800000;
          auVar228._12_4_ = 0x3f800000;
          auVar264._8_4_ = 0x3f318000;
          auVar264._0_8_ = 0x3f3180003f318000;
          auVar264._12_4_ = 0x3f318000;
          auVar165 = vsubps_avx512vl(auVar162,auVar228);
          bVar13 = (bool)((byte)uVar157 & 1);
          auVar182._0_4_ = (float)((uint)bVar13 * auVar165._0_4_ | (uint)!bVar13 * auVar162._0_4_);
          bVar13 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar182._4_4_ = (float)((uint)bVar13 * auVar165._4_4_ | (uint)!bVar13 * auVar162._4_4_);
          bVar13 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar182._8_4_ = (float)((uint)bVar13 * auVar165._8_4_ | (uint)!bVar13 * auVar162._8_4_);
          bVar13 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar182._12_4_ =
               (float)((uint)bVar13 * auVar165._12_4_ | (uint)!bVar13 * auVar162._12_4_);
          auVar162 = vfmsub231ps_fma(auVar164,auVar182,auVar264);
          auVar298._8_4_ = 0xb95e8083;
          auVar298._0_8_ = 0xb95e8083b95e8083;
          auVar298._12_4_ = 0xb95e8083;
          auVar162 = vfnmsub231ps_fma(auVar162,auVar182,auVar298);
          auVar333._0_4_ = auVar162._0_4_ * auVar162._0_4_;
          auVar333._4_4_ = auVar162._4_4_ * auVar162._4_4_;
          auVar333._8_4_ = auVar162._8_4_ * auVar162._8_4_;
          auVar333._12_4_ = auVar162._12_4_ * auVar162._12_4_;
          auVar304._8_4_ = 0x3ab743ce;
          auVar304._0_8_ = 0x3ab743ce3ab743ce;
          auVar304._12_4_ = 0x3ab743ce;
          auVar281._8_4_ = 0x39506967;
          auVar281._0_8_ = 0x3950696739506967;
          auVar281._12_4_ = 0x39506967;
          auVar164 = vfmadd213ps_avx512vl(auVar281,auVar162,auVar304);
          auVar309._8_4_ = 0x3c088908;
          auVar309._0_8_ = 0x3c0889083c088908;
          auVar309._12_4_ = 0x3c088908;
          auVar314._8_4_ = 0x3d2aa9c1;
          auVar314._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar314._12_4_ = 0x3d2aa9c1;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar162,auVar309);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar162,auVar314);
          auVar319._8_4_ = 0x3e2aaaaa;
          auVar319._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar319._12_4_ = 0x3e2aaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar162,auVar319);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar162,auVar241);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar333,auVar162);
          auVar165 = vaddps_avx512vl(auVar164,auVar228);
          auVar324._0_4_ = (int)auVar182._0_4_;
          auVar324._4_4_ = (int)auVar182._4_4_;
          auVar324._8_4_ = (int)auVar182._8_4_;
          auVar324._12_4_ = (int)auVar182._12_4_;
          auVar162 = vpslld_avx(auVar324,0x17);
          auVar325._8_4_ = 0x3f800000;
          auVar325._0_8_ = 0x3f8000003f800000;
          auVar325._12_4_ = 0x3f800000;
          auVar162 = vpaddd_avx(auVar162,auVar325);
          auVar162 = vfmadd213ps_fma(auVar162,auVar165,auVar228);
          auVar171._8_4_ = 0x800000;
          auVar171._0_8_ = 0x80000000800000;
          auVar171._12_4_ = 0x800000;
          auVar165 = vmaxps_avx512vl(auVar162,auVar171);
          auVar164 = vxorps_avx512vl(auVar164,auVar164);
          auVar166 = vpsrld_avx512vl(auVar165,0x17);
          auVar167 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar170._8_4_ = 0x807fffff;
          auVar170._0_8_ = 0x807fffff807fffff;
          auVar170._12_4_ = 0x807fffff;
          auVar165 = vpternlogd_avx512vl(auVar167,auVar165,auVar170,0xf8);
          auVar172._8_4_ = 0xffffff82;
          auVar172._0_8_ = 0xffffff82ffffff82;
          auVar172._12_4_ = 0xffffff82;
          auVar166 = vpaddd_avx512vl(auVar166,auVar172);
          uVar157 = vcmpps_avx512vl(auVar162,auVar164,2);
          auVar162 = vcvtdq2ps_avx(auVar166);
          auVar173._8_4_ = 0x3f3504f3;
          auVar173._0_8_ = 0x3f3504f33f3504f3;
          auVar173._12_4_ = 0x3f3504f3;
          uVar136 = vcmpps_avx512vl(auVar165,auVar173,1);
          auVar34._8_4_ = 0xbf800000;
          auVar34._0_8_ = 0xbf800000bf800000;
          auVar34._12_4_ = 0xbf800000;
          auVar164 = vaddps_avx512vl(auVar165,auVar34);
          auVar166 = vsubps_avx512vl(auVar162,auVar228);
          bVar13 = (bool)((byte)uVar136 & 1);
          auVar183._0_4_ = (uint)bVar13 * auVar166._0_4_ | (uint)!bVar13 * auVar162._0_4_;
          bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar183._4_4_ = (uint)bVar13 * auVar166._4_4_ | (uint)!bVar13 * auVar162._4_4_;
          bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar183._8_4_ = (uint)bVar13 * auVar166._8_4_ | (uint)!bVar13 * auVar162._8_4_;
          bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar183._12_4_ = (uint)bVar13 * auVar166._12_4_ | (uint)!bVar13 * auVar162._12_4_;
          auVar162 = vaddps_avx512vl(auVar164,auVar165);
          bVar13 = (bool)((byte)uVar136 & 1);
          auVar184._0_4_ = (uint)bVar13 * auVar162._0_4_ | (uint)!bVar13 * auVar164._0_4_;
          bVar13 = (bool)((byte)(uVar136 >> 1) & 1);
          auVar184._4_4_ = (uint)bVar13 * auVar162._4_4_ | (uint)!bVar13 * auVar164._4_4_;
          bVar13 = (bool)((byte)(uVar136 >> 2) & 1);
          auVar184._8_4_ = (uint)bVar13 * auVar162._8_4_ | (uint)!bVar13 * auVar164._8_4_;
          bVar13 = (bool)((byte)(uVar136 >> 3) & 1);
          auVar184._12_4_ = (uint)bVar13 * auVar162._12_4_ | (uint)!bVar13 * auVar164._12_4_;
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar35._8_4_ = 0xbdebd1b8;
          auVar35._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar35._12_4_ = 0xbdebd1b8;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar35);
          auVar36._8_4_ = 0x3def251a;
          auVar36._0_8_ = 0x3def251a3def251a;
          auVar36._12_4_ = 0x3def251a;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar36);
          auVar37._8_4_ = 0xbdfe5d4f;
          auVar37._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar37._12_4_ = 0xbdfe5d4f;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar37);
          auVar38._8_4_ = 0x3e11e9bf;
          auVar38._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar38._12_4_ = 0x3e11e9bf;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar38);
          auVar39._8_4_ = 0xbe2aae50;
          auVar39._0_8_ = 0xbe2aae50be2aae50;
          auVar39._12_4_ = 0xbe2aae50;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar39);
          auVar40._8_4_ = 0x3e4cceac;
          auVar40._0_8_ = 0x3e4cceac3e4cceac;
          auVar40._12_4_ = 0x3e4cceac;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar40);
          auVar41._8_4_ = 0xbe7ffffc;
          auVar41._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar41._12_4_ = 0xbe7ffffc;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar41);
          auVar164 = vmulps_avx512vl(auVar184,auVar184);
          auVar42._8_4_ = 0x3eaaaaaa;
          auVar42._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar42._12_4_ = 0x3eaaaaaa;
          auVar162 = vfmadd213ps_avx512vl(auVar162,auVar184,auVar42);
          auVar165 = vmulps_avx512vl(auVar164,auVar184);
          auVar162 = vmulps_avx512vl(auVar165,auVar162);
          auVar162 = vfmadd231ps_avx512vl(auVar162,auVar183,auVar298);
          auVar162 = vfmsub231ps_avx512vl(auVar162,auVar241,auVar164);
          auVar162 = vsubps_avx512vl(auVar162,auVar184);
          auVar162 = vfnmadd231ps_fma(auVar162,auVar264,auVar183);
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar157 & 1);
          auVar185._0_4_ =
               (uint)bVar13 * auVar164._0_4_ |
               (uint)!bVar13 * (int)(auVar162._0_4_ + auVar162._0_4_);
          bVar13 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar185._4_4_ =
               (uint)bVar13 * auVar164._4_4_ |
               (uint)!bVar13 * (int)(auVar162._4_4_ + auVar162._4_4_);
          bVar13 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar185._8_4_ =
               (uint)bVar13 * auVar164._8_4_ |
               (uint)!bVar13 * (int)(auVar162._8_4_ + auVar162._8_4_);
          bVar13 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar185._12_4_ =
               (uint)bVar13 * auVar164._12_4_ |
               (uint)!bVar13 * (int)(auVar162._12_4_ + auVar162._12_4_);
          auVar162 = vminps_avx(auVar185,auVar287);
          auVar164 = vmaxps_avx(auVar162,auVar292);
          auVar165 = vfmadd213ps_fma(auVar272,auVar164,auVar241);
          auVar293._0_4_ = (int)auVar165._0_4_;
          auVar293._4_4_ = (int)auVar165._4_4_;
          auVar293._8_4_ = (int)auVar165._8_4_;
          auVar293._12_4_ = (int)auVar165._12_4_;
          auVar162 = vcvtdq2ps_avx(auVar293);
          uVar157 = vcmpps_avx512vl(auVar165,auVar162,1);
          auVar165 = vsubps_avx512vl(auVar162,auVar228);
          bVar13 = (bool)((byte)uVar157 & 1);
          auVar186._0_4_ = (float)((uint)bVar13 * auVar165._0_4_ | (uint)!bVar13 * auVar162._0_4_);
          bVar13 = (bool)((byte)(uVar157 >> 1) & 1);
          auVar186._4_4_ = (float)((uint)bVar13 * auVar165._4_4_ | (uint)!bVar13 * auVar162._4_4_);
          bVar13 = (bool)((byte)(uVar157 >> 2) & 1);
          auVar186._8_4_ = (float)((uint)bVar13 * auVar165._8_4_ | (uint)!bVar13 * auVar162._8_4_);
          bVar13 = (bool)((byte)(uVar157 >> 3) & 1);
          auVar186._12_4_ =
               (float)((uint)bVar13 * auVar165._12_4_ | (uint)!bVar13 * auVar162._12_4_);
          auVar162 = vfmsub213ps_fma(auVar264,auVar186,auVar164);
          auVar164 = vfnmsub231ps_fma(auVar162,auVar186,auVar298);
          auVar273._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar273._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar273._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar273._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar162 = vfmadd213ps_fma(auVar281,auVar164,auVar304);
          auVar162 = vfmadd213ps_fma(auVar162,auVar164,auVar309);
          auVar162 = vfmadd213ps_fma(auVar162,auVar164,auVar314);
          auVar162 = vfmadd213ps_fma(auVar162,auVar164,auVar319);
          auVar162 = vfmadd213ps_fma(auVar162,auVar164,auVar241);
          auVar162 = vfmadd213ps_fma(auVar162,auVar273,auVar164);
          auVar242._0_4_ = auVar162._0_4_ + 1.0;
          auVar242._4_4_ = auVar162._4_4_ + 1.0;
          auVar242._8_4_ = auVar162._8_4_ + 1.0;
          auVar242._12_4_ = auVar162._12_4_ + 1.0;
          auVar265._0_4_ = (int)auVar186._0_4_;
          auVar265._4_4_ = (int)auVar186._4_4_;
          auVar265._8_4_ = (int)auVar186._8_4_;
          auVar265._12_4_ = (int)auVar186._12_4_;
          auVar162 = vpslld_avx(auVar265,0x17);
          auVar162 = vpaddd_avx(auVar325,auVar162);
          auVar164 = vfmadd213ps_fma(auVar162,auVar242,auVar228);
          auVar162 = vrcpps_avx(auVar164);
          auVar243._0_4_ = auVar162._0_4_ + auVar162._0_4_;
          auVar243._4_4_ = auVar162._4_4_ + auVar162._4_4_;
          auVar243._8_4_ = auVar162._8_4_ + auVar162._8_4_;
          auVar243._12_4_ = auVar162._12_4_ + auVar162._12_4_;
          auVar43._8_4_ = 0x40000000;
          auVar43._0_8_ = 0x4000000040000000;
          auVar43._12_4_ = 0x40000000;
          auVar164 = vfmsub213ps_avx512vl(auVar164,auVar243,auVar43);
          auVar162 = vfnmadd213ps_fma(auVar164,auVar162,auVar243);
          auVar163 = vfmsub231ps_fma(auVar163,auVar163,auVar162);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar174._4_4_ = uVar1;
          auVar174._0_4_ = uVar1;
          auVar174._8_4_ = uVar1;
          auVar174._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar164._4_4_ = uVar1;
          auVar164._0_4_ = uVar1;
          auVar164._8_4_ = uVar1;
          auVar164._12_4_ = uVar1;
          auVar162 = vfmadd213ps_avx512vl(auVar174,auVar163,auVar164);
          auVar223._12_4_ = 0;
          auVar223._0_12_ = ZEXT412(0);
          auVar162 = vmaxps_avx(auVar162,auVar223 << 0x20);
          auVar165._8_4_ = 0x3f800000;
          auVar165._0_8_ = 0x3f8000003f800000;
          auVar165._12_4_ = 0x3f800000;
          auVar162 = vminps_avx512vl(auVar162,auVar165);
          auVar163._0_4_ = auVar162._0_4_ * auVar163._0_4_;
          auVar163._4_4_ = auVar162._4_4_ * auVar163._4_4_;
          auVar163._8_4_ = auVar162._8_4_ * auVar163._8_4_;
          auVar163._12_4_ = auVar162._12_4_ * auVar163._12_4_;
        }
        uVar157 = CONCAT44(uStack_2a4,local_2a8);
        *(undefined1 (*) [16])((long)top_blob->data + uVar157 * 4) = auVar163;
        auVar162 = local_2b8;
      }
      local_2b8 = auVar162;
      iVar135 = (int)uVar157 + uVar148 * 4;
      iVar145 = 0;
      if ((int)uVar133 <= iVar135) goto LAB_002a99ee;
      uVar157 = (ulong)iVar135;
      do {
        auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar10 != 0) {
          auVar301 = ZEXT464(*(uint *)(lVar10 + uVar157 * 4));
        }
        fVar255 = auVar301._0_4_;
        pauVar140 = (undefined1 (*) [16])
                    ((long)(this->weight_data_tm).w * uVar157 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        pauVar141 = local_308;
        if ((int)uVar134 < 8) {
          _local_218 = SUB6432(ZEXT864(0),0);
          uVar133 = 0;
        }
        else {
          auVar290 = ZEXT864(0);
          iVar145 = 7;
          do {
            auVar162 = vlddqu_avx(*pauVar140);
            auVar193 = vcvtph2ps_f16c(auVar162);
            auVar162 = vfmadd231ps_fma(auVar290._0_32_,auVar193,*pauVar141);
            auVar290 = ZEXT1664(auVar162);
            _local_218 = ZEXT1632(auVar162);
            pauVar141 = pauVar141 + 1;
            pauVar140 = pauVar140 + 1;
            iVar145 = iVar145 + 8;
            uVar133 = uVar134 & 0xfffffff8;
          } while (iVar145 < (int)uVar134);
        }
        auVar162 = ZEXT816(0) << 0x40;
        uVar148 = uVar133 | 3;
        while ((int)uVar148 < (int)uVar134) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)*pauVar140;
          auVar163 = vcvtph2ps_f16c(auVar6);
          auVar162 = vfmadd231ps_fma(auVar162,auVar163,*(undefined1 (*) [16])*pauVar141);
          pauVar141 = (undefined1 (*) [32])(*pauVar141 + 0x10);
          pauVar140 = (undefined1 (*) [16])(*pauVar140 + 8);
          uVar148 = uVar133 + 7;
          uVar133 = uVar133 + 4;
        }
        if ((int)uVar133 < (int)uVar134) {
          lVar146 = 0;
          do {
            local_298._0_4_ = auVar301._0_4_;
            uVar148 = *(uint *)(*pauVar141 + lVar146 * 4);
            auVar296._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar140 + lVar146 * 2));
            auVar296._4_60_ = extraout_var_01;
            auVar163 = vfmadd231ss_fma(ZEXT416((uint)local_298._0_4_),auVar296._0_16_,
                                       ZEXT416(uVar148));
            fVar255 = auVar163._0_4_;
            auVar301 = ZEXT1664(auVar163);
            lVar146 = lVar146 + 1;
          } while (uVar134 - uVar133 != (int)lVar146);
        }
        local_378 = auVar162._0_4_;
        fStack_374 = auVar162._4_4_;
        fStack_370 = auVar162._8_4_;
        fStack_36c = auVar162._12_4_;
        auVar225._0_4_ = (float)local_218._0_4_ + local_378 + fStack_208;
        auVar225._4_4_ = (float)local_218._4_4_ + fStack_374 + fStack_204;
        auVar225._8_4_ = fStack_210 + fStack_370 + fStack_200;
        auVar225._12_4_ = fStack_20c + fStack_36c + fStack_1fc;
        auVar162 = vhaddps_avx(auVar225,auVar225);
        auVar162 = vhaddps_avx(auVar162,auVar162);
        fVar255 = auVar162._0_4_ + fVar255;
        auVar162 = ZEXT416((uint)fVar255);
        fVar222 = fVar255;
        switch(iVar7) {
        case 1:
          auVar162 = vmaxss_avx(auVar162,ZEXT416(0));
          fVar222 = auVar162._0_4_;
          break;
        case 2:
          uVar17 = vcmpss_avx512f(auVar162,ZEXT416(0),0xe);
          bVar13 = (bool)((byte)uVar17 & 1);
          fVar222 = (float)((uint)bVar13 * 0x3f800000 +
                           (uint)!bVar13 * **(int **)(&this->field_0xe8 + (long)p_Var8)) * fVar255;
          break;
        case 3:
          fVar255 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar162 = vmaxss_avx(auVar162,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var8)));
          fVar222 = auVar162._0_4_;
          if (fVar255 < auVar162._0_4_) {
            fVar222 = fVar255;
          }
          break;
        case 4:
          auVar162 = vminss_avx(auVar162,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar58._8_4_ = 0x80000000;
          auVar58._0_8_ = 0x8000000080000000;
          auVar58._12_4_ = 0x80000000;
          auVar163 = vxorps_avx512vl(auVar162,auVar58);
          uVar17 = vcmpss_avx512f(auVar162,ZEXT416(0xc2b0c0a5),1);
          bVar13 = (bool)((byte)uVar17 & 1);
          fVar255 = expf((float)((uint)bVar13 * 0x42b0c0a5 + (uint)!bVar13 * auVar163._0_4_));
          fVar222 = 1.0 / (fVar255 + 1.0);
          break;
        case 5:
          local_298._0_4_ = fVar255;
          fVar255 = expf(fVar255);
          fVar255 = logf(fVar255 + 1.0);
          fVar255 = tanhf(fVar255);
          fVar222 = fVar255 * (float)local_298._0_4_;
          break;
        case 6:
          fVar4 = **(float **)(&this->field_0xe8 + (long)p_Var8);
          auVar57._8_4_ = 0x80000000;
          auVar57._0_8_ = 0x8000000080000000;
          auVar57._12_4_ = 0x80000000;
          auVar164 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var8))[1]);
          auVar163 = vxorps_avx512vl(auVar164,auVar57);
          fVar256 = auVar163._0_4_ / fVar4;
          fVar222 = 0.0;
          if ((fVar256 <= fVar255) && (fVar222 = fVar255, fVar255 <= fVar256 + 1.0 / fVar4)) {
            auVar162 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar162,auVar164);
            fVar222 = auVar162._0_4_ * fVar255;
          }
        }
        *(float *)((long)top_blob->data + uVar157 * 4) = fVar222;
        uVar157 = uVar157 + 1;
      } while (uVar157 != local_238);
    }
    else {
      iVar145 = 0;
      if ((iVar135 != 4) || (iVar145 = iVar131, (int)uVar133 < 1)) goto LAB_002a99ee;
      uVar136 = 0;
      auVar223 = ZEXT816(0);
      auVar162 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar163 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar271._8_4_ = 0x3f000000;
      auVar271._0_8_ = 0x3f0000003f000000;
      auVar271._12_4_ = 0x3f000000;
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar286._8_4_ = 0x3f800000;
      auVar286._0_8_ = 0x3f8000003f800000;
      auVar286._12_4_ = 0x3f800000;
      auVar291._8_4_ = 0x3f318000;
      auVar291._0_8_ = 0x3f3180003f318000;
      auVar291._12_4_ = 0x3f318000;
      auVar303._8_4_ = 0x39506967;
      auVar303._0_8_ = 0x3950696739506967;
      auVar303._12_4_ = 0x39506967;
      auVar308._8_4_ = 0x3ab743ce;
      auVar308._0_8_ = 0x3ab743ce3ab743ce;
      auVar308._12_4_ = 0x3ab743ce;
      auVar313._8_4_ = 0x3c088908;
      auVar313._0_8_ = 0x3c0889083c088908;
      auVar313._12_4_ = 0x3c088908;
      auVar318._8_4_ = 0x3d2aa9c1;
      auVar318._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar318._12_4_ = 0x3d2aa9c1;
      auVar323._8_4_ = 0x3e2aaaaa;
      auVar323._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar323._12_4_ = 0x3e2aaaaa;
      auVar329._8_4_ = 0x3f800000;
      auVar329._0_8_ = 0x3f8000003f800000;
      auVar329._12_4_ = 0x3f800000;
      auVar332._8_4_ = 0xb95e8083;
      auVar332._0_8_ = 0xb95e8083b95e8083;
      auVar332._12_4_ = 0xb95e8083;
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar174 = ZEXT816(0) << 0x40;
        if (lVar10 != 0) {
          auVar174 = *(undefined1 (*) [16])(lVar10 + uVar136 * 0x10);
        }
        pauVar141 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar170 = in_ZMM17._0_16_;
        auVar172 = in_ZMM18._0_16_;
        auVar171 = in_ZMM16._0_16_;
        pauVar144 = local_308;
        if ((int)uVar134 < 8) {
          auVar171 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM16 = ZEXT1664(auVar171);
          auVar171 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM18 = ZEXT1664(auVar171);
          auVar171 = vxorps_avx512vl(auVar170,auVar170);
          in_ZMM17 = ZEXT1664(auVar171);
          auVar301 = ZEXT864(0);
          uVar133 = 0;
        }
        else {
          auVar301 = ZEXT864(0);
          iVar145 = 7;
          auVar170 = vxorps_avx512vl(auVar170,auVar170);
          in_ZMM17 = ZEXT1664(auVar170);
          auVar170 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM18 = ZEXT1664(auVar170);
          auVar171 = vxorps_avx512vl(auVar171,auVar171);
          in_ZMM16 = ZEXT1664(auVar171);
          do {
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar144));
            auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 4)));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 8)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 0xc)));
            auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar170,1);
            auVar189 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar173,1);
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 0x10)));
            auVar170 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 0x14)));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 0x18)));
            auVar190 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar170,1);
            auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 0x1c)));
            auVar191 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar171,1);
            auVar193 = vlddqu_avx(*pauVar141);
            auVar194 = vlddqu_avx(pauVar141[1]);
            auVar192 = vcvtph2ps_avx512vl(auVar193._0_16_);
            auVar188 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar188,auVar192);
            auVar301 = ZEXT3264(auVar188);
            auVar193 = vcvtph2ps_f16c(auVar193._16_16_);
            auVar193 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar189,auVar193);
            in_ZMM17 = ZEXT3264(auVar193);
            auVar193 = vcvtph2ps_f16c(auVar194._0_16_);
            auVar193 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar190,auVar193);
            in_ZMM18 = ZEXT3264(auVar193);
            auVar193 = vcvtph2ps_f16c(auVar194._16_16_);
            auVar193 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar191,auVar193);
            in_ZMM16 = ZEXT3264(auVar193);
            pauVar144 = pauVar144 + 1;
            pauVar141 = pauVar141 + 2;
            iVar145 = iVar145 + 8;
            uVar133 = uVar134 & 0xfffffff8;
          } while (iVar145 < (int)uVar134);
        }
        auVar193 = auVar301._0_32_;
        uVar148 = uVar133 | 3;
        while ((int)uVar148 < (int)uVar134) {
          uVar1 = *(undefined4 *)*pauVar144;
          auVar246._4_4_ = uVar1;
          auVar246._0_4_ = uVar1;
          auVar246._8_4_ = uVar1;
          auVar246._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar144 + 4);
          auVar246._20_4_ = uVar1;
          auVar246._16_4_ = uVar1;
          auVar246._24_4_ = uVar1;
          auVar246._28_4_ = uVar1;
          auVar171 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar144 + 8)));
          uVar1 = *(undefined4 *)(*pauVar144 + 0xc);
          auVar257._4_4_ = uVar1;
          auVar257._0_4_ = uVar1;
          auVar257._8_4_ = uVar1;
          auVar257._12_4_ = uVar1;
          auVar188 = vinsertf32x4_avx512vl(ZEXT1632(auVar171),auVar257,1);
          auVar194 = vlddqu_avx(*pauVar141);
          auVar193 = vcvtph2ps_avx512vl(auVar194._0_16_);
          auVar193 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar246,auVar193);
          auVar301 = ZEXT3264(auVar193);
          auVar194 = vcvtph2ps_f16c(auVar194._16_16_);
          auVar194 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar188,auVar194);
          in_ZMM17 = ZEXT3264(auVar194);
          pauVar144 = (undefined1 (*) [32])(*pauVar144 + 0x10);
          pauVar141 = pauVar141 + 1;
          uVar148 = uVar133 + 7;
          uVar133 = uVar133 + 4;
        }
        if (uVar134 - uVar133 != 0 && (int)uVar133 <= (int)uVar134) {
          lVar146 = 0;
          do {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(*pauVar141 + lVar146 * 8);
            auVar171 = vcvtph2ps_f16c(auVar5);
            uVar1 = *(undefined4 *)(*pauVar144 + lVar146 * 4);
            auVar18._4_4_ = uVar1;
            auVar18._0_4_ = uVar1;
            auVar18._8_4_ = uVar1;
            auVar18._12_4_ = uVar1;
            auVar174 = vfmadd231ps_avx512vl(auVar174,auVar171,auVar18);
            lVar146 = lVar146 + 1;
          } while (uVar134 - uVar133 != (int)lVar146);
        }
        auVar194 = vaddps_avx512vl(in_ZMM18._0_32_,in_ZMM16._0_32_);
        auVar193 = vaddps_avx512vl(in_ZMM17._0_32_,auVar193);
        fVar255 = auVar194._4_4_ + auVar193._4_4_;
        auVar180._0_4_ =
             auVar194._16_4_ + auVar193._16_4_ + auVar194._0_4_ + auVar193._0_4_ + auVar174._0_4_;
        auVar180._4_4_ = fVar255 + fVar255 + auVar174._4_4_;
        auVar180._8_4_ =
             auVar194._24_4_ + auVar193._24_4_ + auVar194._8_4_ + auVar193._8_4_ + auVar174._8_4_;
        auVar180._12_4_ =
             auVar194._28_4_ + auVar193._28_4_ + auVar194._12_4_ + auVar193._12_4_ + auVar174._12_4_
        ;
        switch(iVar7) {
        case 1:
          auVar180 = vmaxps_avx(auVar180,auVar223);
          break;
        case 2:
          auVar174 = vmaxps_avx(auVar180,auVar223);
          auVar171 = vminps_avx(auVar180,auVar223);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar180 = vfmadd132ps_avx512vl(auVar171,auVar174,auVar33);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar174 = vmaxps_avx512vl(auVar180,auVar31);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar180 = vminps_avx512vl(auVar174,auVar32);
          break;
        case 4:
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar174 = vxorps_avx512vl(auVar180,auVar29);
          auVar174 = vminps_avx512vl(auVar174,auVar162);
          auVar171 = vmaxps_avx512vl(auVar174,auVar163);
          auVar170 = vfmadd231ps_avx512vl(auVar271,auVar171,auVar164);
          auVar262._0_4_ = (int)auVar170._0_4_;
          auVar262._4_4_ = (int)auVar170._4_4_;
          auVar262._8_4_ = (int)auVar170._8_4_;
          auVar262._12_4_ = (int)auVar170._12_4_;
          auVar174 = vcvtdq2ps_avx(auVar262);
          uVar15 = vcmpps_avx512vl(auVar170,auVar174,1);
          auVar170 = vsubps_avx512vl(auVar174,auVar286);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar181._0_4_ = (float)((uint)bVar13 * auVar170._0_4_ | (uint)!bVar13 * auVar174._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar181._4_4_ = (float)((uint)bVar13 * auVar170._4_4_ | (uint)!bVar13 * auVar174._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar181._8_4_ = (float)((uint)bVar13 * auVar170._8_4_ | (uint)!bVar13 * auVar174._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar181._12_4_ =
               (float)((uint)bVar13 * auVar170._12_4_ | (uint)!bVar13 * auVar174._12_4_);
          auVar174 = vfmsub231ps_fma(auVar171,auVar181,auVar291);
          auVar30._8_4_ = 0x395e8083;
          auVar30._0_8_ = 0x395e8083395e8083;
          auVar30._12_4_ = 0x395e8083;
          auVar171 = vfmsub231ps_avx512vl(auVar174,auVar181,auVar30);
          auVar238._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar238._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar238._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar238._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar174 = vfmadd213ps_fma(auVar303,auVar171,auVar308);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar313);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar318);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar323);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar271);
          auVar174 = vfmadd213ps_fma(auVar174,auVar238,auVar171);
          auVar239._0_4_ = auVar174._0_4_ + 1.0;
          auVar239._4_4_ = auVar174._4_4_ + 1.0;
          auVar239._8_4_ = auVar174._8_4_ + 1.0;
          auVar239._12_4_ = auVar174._12_4_ + 1.0;
          auVar227._0_4_ = (int)auVar181._0_4_;
          auVar227._4_4_ = (int)auVar181._4_4_;
          auVar227._8_4_ = (int)auVar181._8_4_;
          auVar227._12_4_ = (int)auVar181._12_4_;
          auVar174 = vpslld_avx(auVar227,0x17);
          auVar174 = vpaddd_avx(auVar329,auVar174);
          auVar171 = vfmadd213ps_fma(auVar174,auVar239,auVar286);
          auVar174 = vrcpps_avx(auVar171);
          auVar171 = vfmsub213ps_fma(auVar171,auVar174,auVar286);
          auVar180 = vfnmadd132ps_fma(auVar171,auVar174,auVar174);
          break;
        case 5:
          auVar174 = vminps_avx512vl(auVar180,auVar162);
          auVar170 = vmaxps_avx512vl(auVar174,auVar163);
          auVar171 = vfmadd213ps_fma(auVar164,auVar170,auVar271);
          auVar277._0_4_ = (int)auVar171._0_4_;
          auVar277._4_4_ = (int)auVar171._4_4_;
          auVar277._8_4_ = (int)auVar171._8_4_;
          auVar277._12_4_ = (int)auVar171._12_4_;
          auVar174 = vcvtdq2ps_avx(auVar277);
          uVar15 = vcmpps_avx512vl(auVar171,auVar174,1);
          auVar171 = vsubps_avx512vl(auVar174,auVar286);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar175._0_4_ = (float)((uint)bVar13 * auVar171._0_4_ | (uint)!bVar13 * auVar174._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar175._4_4_ = (float)((uint)bVar13 * auVar171._4_4_ | (uint)!bVar13 * auVar174._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar175._8_4_ = (float)((uint)bVar13 * auVar171._8_4_ | (uint)!bVar13 * auVar174._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar175._12_4_ =
               (float)((uint)bVar13 * auVar171._12_4_ | (uint)!bVar13 * auVar174._12_4_);
          auVar174 = vfmsub231ps_fma(auVar170,auVar175,auVar291);
          auVar171 = vfnmsub231ps_fma(auVar174,auVar175,auVar332);
          auVar258._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar258._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar258._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar258._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar174 = vfmadd213ps_fma(auVar303,auVar171,auVar308);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar313);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar318);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar323);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar271);
          auVar174 = vfmadd213ps_fma(auVar174,auVar258,auVar171);
          auVar235._0_4_ = auVar174._0_4_ + 1.0;
          auVar235._4_4_ = auVar174._4_4_ + 1.0;
          auVar235._8_4_ = auVar174._8_4_ + 1.0;
          auVar235._12_4_ = auVar174._12_4_ + 1.0;
          auVar259._0_4_ = (int)auVar175._0_4_;
          auVar259._4_4_ = (int)auVar175._4_4_;
          auVar259._8_4_ = (int)auVar175._8_4_;
          auVar259._12_4_ = (int)auVar175._12_4_;
          auVar174 = vpslld_avx(auVar259,0x17);
          auVar174 = vpaddd_avx(auVar329,auVar174);
          auVar174 = vfmadd213ps_fma(auVar174,auVar235,auVar286);
          uVar15 = vcmpps_avx512vl(auVar174,auVar223,2);
          auVar20._8_4_ = 0x800000;
          auVar20._0_8_ = 0x80000000800000;
          auVar20._12_4_ = 0x800000;
          auVar174 = vmaxps_avx512vl(auVar174,auVar20);
          auVar170 = vpsrld_avx(auVar174,0x17);
          auVar278._8_4_ = 0x807fffff;
          auVar278._0_8_ = 0x807fffff807fffff;
          auVar278._12_4_ = 0x807fffff;
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar174 = vpternlogd_avx512vl(auVar174,auVar278,auVar21,0xea);
          auVar22._8_4_ = 0x3f3504f3;
          auVar22._0_8_ = 0x3f3504f33f3504f3;
          auVar22._12_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar174,auVar22,1);
          auVar23._8_4_ = 0xbf800000;
          auVar23._0_8_ = 0xbf800000bf800000;
          auVar23._12_4_ = 0xbf800000;
          auVar171 = vaddps_avx512vl(auVar174,auVar23);
          auVar174 = vaddps_avx512vl(auVar171,auVar174);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar176._0_4_ = (float)((uint)bVar13 * auVar174._0_4_ | (uint)!bVar13 * auVar171._0_4_);
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar176._4_4_ = (float)((uint)bVar13 * auVar174._4_4_ | (uint)!bVar13 * auVar171._4_4_);
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar176._8_4_ = (float)((uint)bVar13 * auVar174._8_4_ | (uint)!bVar13 * auVar171._8_4_);
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar176._12_4_ =
               (float)((uint)bVar13 * auVar174._12_4_ | (uint)!bVar13 * auVar171._12_4_);
          auVar236._0_4_ = auVar176._0_4_ * auVar176._0_4_;
          auVar236._4_4_ = auVar176._4_4_ * auVar176._4_4_;
          auVar236._8_4_ = auVar176._8_4_ * auVar176._8_4_;
          auVar236._12_4_ = auVar176._12_4_ * auVar176._12_4_;
          auVar297._8_4_ = 0x3d9021bb;
          auVar297._0_8_ = 0x3d9021bb3d9021bb;
          auVar297._12_4_ = 0x3d9021bb;
          auVar24._8_4_ = 0xbdebd1b8;
          auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar24._12_4_ = 0xbdebd1b8;
          auVar174 = vfmadd213ps_avx512vl(auVar297,auVar176,auVar24);
          auVar25._8_4_ = 0x3def251a;
          auVar25._0_8_ = 0x3def251a3def251a;
          auVar25._12_4_ = 0x3def251a;
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar25);
          auVar26._8_4_ = 0xbdfe5d4f;
          auVar26._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar26._12_4_ = 0xbdfe5d4f;
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar26);
          auVar27._8_4_ = 0x3e11e9bf;
          auVar27._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar27._12_4_ = 0x3e11e9bf;
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar27);
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar165);
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar166);
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar167);
          auVar174 = vfmadd213ps_avx512vl(auVar174,auVar176,auVar168);
          auVar171 = vmulps_avx512vl(auVar236,auVar176);
          in_ZMM16 = ZEXT1664(auVar171);
          auVar171 = vmulps_avx512vl(auVar171,auVar174);
          auVar28._8_4_ = 0xffffff82;
          auVar28._0_8_ = 0xffffff82ffffff82;
          auVar28._12_4_ = 0xffffff82;
          auVar174 = vpaddd_avx512vl(auVar170,auVar28);
          auVar174 = vcvtdq2ps_avx(auVar174);
          auVar170 = vsubps_avx512vl(auVar174,auVar286);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar177._0_4_ = (uint)bVar13 * auVar170._0_4_ | (uint)!bVar13 * auVar174._0_4_;
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar177._4_4_ = (uint)bVar13 * auVar170._4_4_ | (uint)!bVar13 * auVar174._4_4_;
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar177._8_4_ = (uint)bVar13 * auVar170._8_4_ | (uint)!bVar13 * auVar174._8_4_;
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar177._12_4_ = (uint)bVar13 * auVar170._12_4_ | (uint)!bVar13 * auVar174._12_4_;
          auVar174 = vfmadd231ps_fma(auVar171,auVar177,auVar332);
          auVar174 = vfmsub231ps_fma(auVar174,auVar271,auVar236);
          auVar174 = vsubps_avx(auVar174,auVar176);
          auVar174 = vfnmadd231ps_fma(auVar174,auVar291,auVar177);
          auVar171 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar178._0_4_ =
               (uint)bVar13 * auVar171._0_4_ |
               (uint)!bVar13 * (int)(auVar174._0_4_ + auVar174._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar178._4_4_ =
               (uint)bVar13 * auVar171._4_4_ |
               (uint)!bVar13 * (int)(auVar174._4_4_ + auVar174._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar178._8_4_ =
               (uint)bVar13 * auVar171._8_4_ |
               (uint)!bVar13 * (int)(auVar174._8_4_ + auVar174._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar178._12_4_ =
               (uint)bVar13 * auVar171._12_4_ |
               (uint)!bVar13 * (int)(auVar174._12_4_ + auVar174._12_4_);
          auVar174 = vminps_avx512vl(auVar178,auVar162);
          auVar170 = vmaxps_avx512vl(auVar174,auVar163);
          auVar171 = vfmadd213ps_fma(auVar164,auVar170,auVar271);
          auVar279._0_4_ = (int)auVar171._0_4_;
          auVar279._4_4_ = (int)auVar171._4_4_;
          auVar279._8_4_ = (int)auVar171._8_4_;
          auVar279._12_4_ = (int)auVar171._12_4_;
          auVar174 = vcvtdq2ps_avx(auVar279);
          uVar15 = vcmpps_avx512vl(auVar171,auVar174,1);
          auVar171 = vsubps_avx512vl(auVar174,auVar286);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar179._0_4_ = (float)((uint)bVar13 * auVar171._0_4_ | (uint)!bVar13 * auVar174._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar179._4_4_ = (float)((uint)bVar13 * auVar171._4_4_ | (uint)!bVar13 * auVar174._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar179._8_4_ = (float)((uint)bVar13 * auVar171._8_4_ | (uint)!bVar13 * auVar174._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar179._12_4_ =
               (float)((uint)bVar13 * auVar171._12_4_ | (uint)!bVar13 * auVar174._12_4_);
          auVar174 = vfmsub231ps_fma(auVar170,auVar179,auVar291);
          auVar171 = vfnmsub231ps_fma(auVar174,auVar179,auVar332);
          auVar260._0_4_ = auVar171._0_4_ * auVar171._0_4_;
          auVar260._4_4_ = auVar171._4_4_ * auVar171._4_4_;
          auVar260._8_4_ = auVar171._8_4_ * auVar171._8_4_;
          auVar260._12_4_ = auVar171._12_4_ * auVar171._12_4_;
          auVar174 = vfmadd213ps_fma(auVar303,auVar171,auVar308);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar313);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar318);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar323);
          auVar174 = vfmadd213ps_fma(auVar174,auVar171,auVar271);
          auVar174 = vfmadd213ps_fma(auVar174,auVar260,auVar171);
          auVar237._0_4_ = auVar174._0_4_ + 1.0;
          auVar237._4_4_ = auVar174._4_4_ + 1.0;
          auVar237._8_4_ = auVar174._8_4_ + 1.0;
          auVar237._12_4_ = auVar174._12_4_ + 1.0;
          auVar261._0_4_ = (int)auVar179._0_4_;
          auVar261._4_4_ = (int)auVar179._4_4_;
          auVar261._8_4_ = (int)auVar179._8_4_;
          auVar261._12_4_ = (int)auVar179._12_4_;
          auVar174 = vpslld_avx(auVar261,0x17);
          auVar174 = vpaddd_avx(auVar329,auVar174);
          auVar171 = vfmadd213ps_fma(auVar174,auVar237,auVar286);
          auVar174 = vrcpps_avx(auVar171);
          auVar280._0_4_ = auVar174._0_4_ + auVar174._0_4_;
          auVar280._4_4_ = auVar174._4_4_ + auVar174._4_4_;
          auVar280._8_4_ = auVar174._8_4_ + auVar174._8_4_;
          auVar280._12_4_ = auVar174._12_4_ + auVar174._12_4_;
          auVar171 = vfmsub213ps_avx512vl(auVar171,auVar280,auVar169);
          auVar174 = vfnmadd213ps_fma(auVar171,auVar174,auVar280);
          auVar180 = vfmsub231ps_fma(auVar180,auVar180,auVar174);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar240._4_4_ = uVar1;
          auVar240._0_4_ = uVar1;
          auVar240._8_4_ = uVar1;
          auVar240._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar19._4_4_ = uVar1;
          auVar19._0_4_ = uVar1;
          auVar19._8_4_ = uVar1;
          auVar19._12_4_ = uVar1;
          auVar174 = vfmadd213ps_avx512vl(auVar240,auVar180,auVar19);
          auVar174 = vmaxps_avx(auVar174,auVar223);
          auVar174 = vminps_avx(auVar174,auVar286);
          auVar180._0_4_ = auVar174._0_4_ * auVar180._0_4_;
          auVar180._4_4_ = auVar174._4_4_ * auVar180._4_4_;
          auVar180._8_4_ = auVar174._8_4_ * auVar180._8_4_;
          auVar180._12_4_ = auVar174._12_4_ * auVar180._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar136 * 0x10) = auVar180;
        uVar136 = uVar136 + 1;
      } while (uVar136 != uVar157);
    }
  }
  else if (iVar135 == 8) {
    if ((int)uVar133 < 1) goto LAB_002a99ee;
    uVar136 = 0;
    auVar193 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar194 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar249._8_4_ = 0x3f000000;
    auVar249._0_8_ = 0x3f0000003f000000;
    auVar249._12_4_ = 0x3f000000;
    auVar249._16_4_ = 0x3f000000;
    auVar249._20_4_ = 0x3f000000;
    auVar249._24_4_ = 0x3f000000;
    auVar249._28_4_ = 0x3f000000;
    auVar285._8_4_ = 0x3fb8aa3b;
    auVar285._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar285._12_4_ = 0x3fb8aa3b;
    auVar285._16_4_ = 0x3fb8aa3b;
    auVar285._20_4_ = 0x3fb8aa3b;
    auVar285._24_4_ = 0x3fb8aa3b;
    auVar285._28_4_ = 0x3fb8aa3b;
    auVar289._8_4_ = 0x3f800000;
    auVar289._0_8_ = 0x3f8000003f800000;
    auVar289._12_4_ = 0x3f800000;
    auVar289._16_4_ = 0x3f800000;
    auVar289._20_4_ = 0x3f800000;
    auVar289._24_4_ = 0x3f800000;
    auVar289._28_4_ = 0x3f800000;
    auVar295._8_4_ = 0x3f318000;
    auVar295._0_8_ = 0x3f3180003f318000;
    auVar295._12_4_ = 0x3f318000;
    auVar295._16_4_ = 0x3f318000;
    auVar295._20_4_ = 0x3f318000;
    auVar295._24_4_ = 0x3f318000;
    auVar295._28_4_ = 0x3f318000;
    auVar306._8_4_ = 0x39506967;
    auVar306._0_8_ = 0x3950696739506967;
    auVar306._12_4_ = 0x39506967;
    auVar306._16_4_ = 0x39506967;
    auVar306._20_4_ = 0x39506967;
    auVar306._24_4_ = 0x39506967;
    auVar306._28_4_ = 0x39506967;
    auVar311._8_4_ = 0x3ab743ce;
    auVar311._0_8_ = 0x3ab743ce3ab743ce;
    auVar311._12_4_ = 0x3ab743ce;
    auVar311._16_4_ = 0x3ab743ce;
    auVar311._20_4_ = 0x3ab743ce;
    auVar311._24_4_ = 0x3ab743ce;
    auVar311._28_4_ = 0x3ab743ce;
    auVar316._8_4_ = 0x3c088908;
    auVar316._0_8_ = 0x3c0889083c088908;
    auVar316._12_4_ = 0x3c088908;
    auVar316._16_4_ = 0x3c088908;
    auVar316._20_4_ = 0x3c088908;
    auVar316._24_4_ = 0x3c088908;
    auVar316._28_4_ = 0x3c088908;
    auVar321._8_4_ = 0x3d2aa9c1;
    auVar321._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar321._12_4_ = 0x3d2aa9c1;
    auVar321._16_4_ = 0x3d2aa9c1;
    auVar321._20_4_ = 0x3d2aa9c1;
    auVar321._24_4_ = 0x3d2aa9c1;
    auVar321._28_4_ = 0x3d2aa9c1;
    auVar327._8_4_ = 0x3e2aaaaa;
    auVar327._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar327._12_4_ = 0x3e2aaaaa;
    auVar327._16_4_ = 0x3e2aaaaa;
    auVar327._20_4_ = 0x3e2aaaaa;
    auVar327._24_4_ = 0x3e2aaaaa;
    auVar327._28_4_ = 0x3e2aaaaa;
    auVar331._8_4_ = 0x3f800000;
    auVar331._0_8_ = 0x3f8000003f800000;
    auVar331._12_4_ = 0x3f800000;
    auVar331._16_4_ = 0x3f800000;
    auVar331._20_4_ = 0x3f800000;
    auVar331._24_4_ = 0x3f800000;
    auVar331._28_4_ = 0x3f800000;
    auVar335._8_4_ = 0xb95e8083;
    auVar335._0_8_ = 0xb95e8083b95e8083;
    auVar335._12_4_ = 0xb95e8083;
    auVar335._16_4_ = 0xb95e8083;
    auVar335._20_4_ = 0xb95e8083;
    auVar335._24_4_ = 0xb95e8083;
    auVar335._28_4_ = 0xb95e8083;
    auVar188 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar189 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
    auVar190 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar201 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    do {
      auVar301 = ZEXT1664(ZEXT816(0) << 0x40);
      if (lVar10 != 0) {
        auVar301 = ZEXT3264(*(undefined1 (*) [32])(lVar10 + uVar136 * 0x20));
      }
      pauVar141 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar163 = in_ZMM17._0_16_;
      auVar162 = in_ZMM16._0_16_;
      auVar166 = in_ZMM20._0_16_;
      auVar165 = in_ZMM19._0_16_;
      auVar167 = in_ZMM23._0_16_;
      auVar164 = in_ZMM18._0_16_;
      pauVar144 = local_308;
      if ((int)uVar134 < 8) {
        auVar164 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM18 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM23 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM19 = ZEXT1664(auVar164);
        auVar164 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM20 = ZEXT1664(auVar164);
        auVar162 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM16 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM17 = ZEXT1664(auVar162);
        auVar290 = ZEXT864(0);
        uVar133 = 0;
      }
      else {
        auVar290 = ZEXT864(0);
        iVar145 = 7;
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        in_ZMM17 = ZEXT1664(auVar163);
        auVar162 = vxorps_avx512vl(auVar162,auVar162);
        in_ZMM16 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM20 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM19 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM23 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM18 = ZEXT1664(auVar162);
        do {
          auVar205 = vlddqu_avx(*pauVar141);
          auVar206 = vlddqu_avx(pauVar141[1]);
          auVar202 = vcvtph2ps_avx512vl(auVar205._0_16_);
          auVar205 = vcvtph2ps_f16c(auVar205._16_16_);
          auVar203 = vcvtph2ps_avx512vl(auVar206._0_16_);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar1 = *(undefined4 *)*pauVar144;
          auVar204._4_4_ = uVar1;
          auVar204._0_4_ = uVar1;
          auVar204._8_4_ = uVar1;
          auVar204._12_4_ = uVar1;
          auVar204._16_4_ = uVar1;
          auVar204._20_4_ = uVar1;
          auVar204._24_4_ = uVar1;
          auVar204._28_4_ = uVar1;
          auVar204 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar202,auVar204);
          auVar301 = ZEXT3264(auVar204);
          uVar1 = *(undefined4 *)(*pauVar144 + 4);
          auVar202._4_4_ = uVar1;
          auVar202._0_4_ = uVar1;
          auVar202._8_4_ = uVar1;
          auVar202._12_4_ = uVar1;
          auVar202._16_4_ = uVar1;
          auVar202._20_4_ = uVar1;
          auVar202._24_4_ = uVar1;
          auVar202._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(auVar290._0_32_,auVar205,auVar202);
          auVar290 = ZEXT3264(auVar205);
          uVar1 = *(undefined4 *)(*pauVar144 + 8);
          auVar205._4_4_ = uVar1;
          auVar205._0_4_ = uVar1;
          auVar205._8_4_ = uVar1;
          auVar205._12_4_ = uVar1;
          auVar205._16_4_ = uVar1;
          auVar205._20_4_ = uVar1;
          auVar205._24_4_ = uVar1;
          auVar205._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar203,auVar205);
          in_ZMM17 = ZEXT3264(auVar205);
          uVar1 = *(undefined4 *)(*pauVar144 + 0xc);
          auVar203._4_4_ = uVar1;
          auVar203._0_4_ = uVar1;
          auVar203._8_4_ = uVar1;
          auVar203._12_4_ = uVar1;
          auVar203._16_4_ = uVar1;
          auVar203._20_4_ = uVar1;
          auVar203._24_4_ = uVar1;
          auVar203._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar206,auVar203);
          in_ZMM16 = ZEXT3264(auVar205);
          auVar205 = vlddqu_avx(pauVar141[2]);
          auVar206 = vlddqu_avx(pauVar141[3]);
          auVar204 = vcvtph2ps_avx512vl(auVar205._0_16_);
          auVar205 = vcvtph2ps_f16c(auVar205._16_16_);
          auVar202 = vcvtph2ps_avx512vl(auVar206._0_16_);
          auVar206 = vcvtph2ps_f16c(auVar206._16_16_);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x10);
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          auVar59._16_4_ = uVar1;
          auVar59._20_4_ = uVar1;
          auVar59._24_4_ = uVar1;
          auVar59._28_4_ = uVar1;
          auVar204 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar204,auVar59);
          in_ZMM20 = ZEXT3264(auVar204);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x14);
          auVar60._4_4_ = uVar1;
          auVar60._0_4_ = uVar1;
          auVar60._8_4_ = uVar1;
          auVar60._12_4_ = uVar1;
          auVar60._16_4_ = uVar1;
          auVar60._20_4_ = uVar1;
          auVar60._24_4_ = uVar1;
          auVar60._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar205,auVar60);
          in_ZMM19 = ZEXT3264(auVar205);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x18);
          auVar61._4_4_ = uVar1;
          auVar61._0_4_ = uVar1;
          auVar61._8_4_ = uVar1;
          auVar61._12_4_ = uVar1;
          auVar61._16_4_ = uVar1;
          auVar61._20_4_ = uVar1;
          auVar61._24_4_ = uVar1;
          auVar61._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar202,auVar61);
          in_ZMM23 = ZEXT3264(auVar205);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x1c);
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          auVar62._16_4_ = uVar1;
          auVar62._20_4_ = uVar1;
          auVar62._24_4_ = uVar1;
          auVar62._28_4_ = uVar1;
          auVar205 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar206,auVar62);
          in_ZMM18 = ZEXT3264(auVar205);
          pauVar144 = pauVar144 + 1;
          pauVar141 = pauVar141 + 4;
          iVar145 = iVar145 + 8;
          uVar133 = uVar134 & 0xfffffff8;
        } while (iVar145 < (int)uVar134);
      }
      auVar205 = auVar290._0_32_;
      uVar148 = uVar133 | 3;
      while( true ) {
        auVar206 = auVar301._0_32_;
        if ((int)uVar134 <= (int)uVar148) break;
        auVar205 = vlddqu_avx(*pauVar141);
        auVar204 = vlddqu_avx(pauVar141[1]);
        auVar202 = vcvtph2ps_avx512vl(auVar205._0_16_);
        auVar205 = vcvtph2ps_f16c(auVar205._16_16_);
        auVar203 = vcvtph2ps_avx512vl(auVar204._0_16_);
        uVar1 = *(undefined4 *)*pauVar144;
        auVar63._4_4_ = uVar1;
        auVar63._0_4_ = uVar1;
        auVar63._8_4_ = uVar1;
        auVar63._12_4_ = uVar1;
        auVar63._16_4_ = uVar1;
        auVar63._20_4_ = uVar1;
        auVar63._24_4_ = uVar1;
        auVar63._28_4_ = uVar1;
        auVar206 = vfmadd231ps_avx512vl(auVar206,auVar202,auVar63);
        auVar301 = ZEXT3264(auVar206);
        uVar1 = *(undefined4 *)(*pauVar144 + 4);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        auVar64._16_4_ = uVar1;
        auVar64._20_4_ = uVar1;
        auVar64._24_4_ = uVar1;
        auVar64._28_4_ = uVar1;
        auVar205 = vfmadd231ps_avx512vl(auVar290._0_32_,auVar205,auVar64);
        auVar290 = ZEXT3264(auVar205);
        uVar1 = *(undefined4 *)(*pauVar144 + 8);
        auVar65._4_4_ = uVar1;
        auVar65._0_4_ = uVar1;
        auVar65._8_4_ = uVar1;
        auVar65._12_4_ = uVar1;
        auVar65._16_4_ = uVar1;
        auVar65._20_4_ = uVar1;
        auVar65._24_4_ = uVar1;
        auVar65._28_4_ = uVar1;
        auVar206 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar203,auVar65);
        in_ZMM17 = ZEXT3264(auVar206);
        auVar206 = vcvtph2ps_f16c(auVar204._16_16_);
        uVar1 = *(undefined4 *)(*pauVar144 + 0xc);
        auVar66._4_4_ = uVar1;
        auVar66._0_4_ = uVar1;
        auVar66._8_4_ = uVar1;
        auVar66._12_4_ = uVar1;
        auVar66._16_4_ = uVar1;
        auVar66._20_4_ = uVar1;
        auVar66._24_4_ = uVar1;
        auVar66._28_4_ = uVar1;
        auVar206 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar206,auVar66);
        in_ZMM16 = ZEXT3264(auVar206);
        pauVar144 = (undefined1 (*) [32])(*pauVar144 + 0x10);
        pauVar141 = pauVar141 + 2;
        uVar148 = uVar133 + 7;
        uVar133 = uVar133 + 4;
      }
      if (uVar134 - uVar133 != 0 && (int)uVar133 <= (int)uVar134) {
        lVar146 = 0;
        do {
          auVar162 = vlddqu_avx(*(undefined1 (*) [16])*pauVar141);
          auVar206 = vcvtph2ps_f16c(auVar162);
          uVar1 = *(undefined4 *)(*pauVar144 + lVar146 * 4);
          auVar67._4_4_ = uVar1;
          auVar67._0_4_ = uVar1;
          auVar67._8_4_ = uVar1;
          auVar67._12_4_ = uVar1;
          auVar67._16_4_ = uVar1;
          auVar67._20_4_ = uVar1;
          auVar67._24_4_ = uVar1;
          auVar67._28_4_ = uVar1;
          auVar206 = vfmadd231ps_avx512vl(auVar301._0_32_,auVar206,auVar67);
          auVar301 = ZEXT3264(auVar206);
          pauVar141 = (undefined1 (*) [32])(*pauVar141 + 0x10);
          lVar146 = lVar146 + 1;
        } while (uVar134 - uVar133 != (int)lVar146);
      }
      auVar204 = vaddps_avx512vl(in_ZMM23._0_32_,in_ZMM18._0_32_);
      auVar202 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
      auVar203 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
      auVar212._0_4_ =
           auVar204._0_4_ + auVar202._0_4_ + auVar205._0_4_ + auVar203._0_4_ + auVar206._0_4_;
      auVar212._4_4_ =
           auVar204._4_4_ + auVar202._4_4_ + auVar205._4_4_ + auVar203._4_4_ + auVar206._4_4_;
      auVar212._8_4_ =
           auVar204._8_4_ + auVar202._8_4_ + auVar205._8_4_ + auVar203._8_4_ + auVar206._8_4_;
      auVar212._12_4_ =
           auVar204._12_4_ + auVar202._12_4_ + auVar205._12_4_ + auVar203._12_4_ + auVar206._12_4_;
      auVar212._16_4_ =
           auVar204._16_4_ + auVar202._16_4_ + auVar205._16_4_ + auVar203._16_4_ + auVar206._16_4_;
      auVar212._20_4_ =
           auVar204._20_4_ + auVar202._20_4_ + auVar205._20_4_ + auVar203._20_4_ + auVar206._20_4_;
      auVar212._24_4_ =
           auVar204._24_4_ + auVar202._24_4_ + auVar205._24_4_ + auVar203._24_4_ + auVar206._24_4_;
      auVar212._28_4_ =
           auVar204._28_4_ + auVar202._28_4_ + auVar205._28_4_ + auVar203._28_4_ + auVar206._28_4_;
      if (iVar7 - 1U < 6) {
        auVar205 = ZEXT1632(ZEXT816(0));
        switch(iVar7) {
        case 1:
          auVar212 = vmaxps_avx(auVar212,ZEXT1632(ZEXT816(0)));
          break;
        case 2:
          auVar206 = vmaxps_avx(auVar212,auVar205);
          auVar205 = vminps_avx(auVar212,auVar205);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar105._4_4_ = uVar1;
          auVar105._0_4_ = uVar1;
          auVar105._8_4_ = uVar1;
          auVar105._12_4_ = uVar1;
          auVar105._16_4_ = uVar1;
          auVar105._20_4_ = uVar1;
          auVar105._24_4_ = uVar1;
          auVar105._28_4_ = uVar1;
          auVar212 = vfmadd132ps_avx512vl(auVar205,auVar206,auVar105);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar103._4_4_ = uVar1;
          auVar103._0_4_ = uVar1;
          auVar103._8_4_ = uVar1;
          auVar103._12_4_ = uVar1;
          auVar103._16_4_ = uVar1;
          auVar103._20_4_ = uVar1;
          auVar103._24_4_ = uVar1;
          auVar103._28_4_ = uVar1;
          auVar205 = vmaxps_avx512vl(auVar212,auVar103);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar104._4_4_ = uVar1;
          auVar104._0_4_ = uVar1;
          auVar104._8_4_ = uVar1;
          auVar104._12_4_ = uVar1;
          auVar104._16_4_ = uVar1;
          auVar104._20_4_ = uVar1;
          auVar104._24_4_ = uVar1;
          auVar104._28_4_ = uVar1;
          auVar212 = vminps_avx512vl(auVar205,auVar104);
          break;
        case 4:
          auVar101._8_4_ = 0x80000000;
          auVar101._0_8_ = 0x8000000080000000;
          auVar101._12_4_ = 0x80000000;
          auVar101._16_4_ = 0x80000000;
          auVar101._20_4_ = 0x80000000;
          auVar101._24_4_ = 0x80000000;
          auVar101._28_4_ = 0x80000000;
          auVar205 = vxorps_avx512vl(auVar212,auVar101);
          auVar205 = vminps_avx512vl(auVar205,auVar193);
          auVar206 = vmaxps_avx512vl(auVar205,auVar194);
          auVar162 = vfmadd231ps_fma(auVar249,auVar206,auVar285);
          auVar205 = vroundps_avx(ZEXT1632(auVar162),1);
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar205,1);
          auVar204 = vsubps_avx512vl(auVar205,auVar289);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar213._0_4_ = (float)((uint)bVar13 * auVar204._0_4_ | (uint)!bVar13 * auVar205._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar213._4_4_ = (float)((uint)bVar13 * auVar204._4_4_ | (uint)!bVar13 * auVar205._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar213._8_4_ = (float)((uint)bVar13 * auVar204._8_4_ | (uint)!bVar13 * auVar205._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar213._12_4_ =
               (float)((uint)bVar13 * auVar204._12_4_ | (uint)!bVar13 * auVar205._12_4_);
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar213._16_4_ =
               (float)((uint)bVar13 * auVar204._16_4_ | (uint)!bVar13 * auVar205._16_4_);
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar213._20_4_ =
               (float)((uint)bVar13 * auVar204._20_4_ | (uint)!bVar13 * auVar205._20_4_);
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar213._24_4_ =
               (float)((uint)bVar13 * auVar204._24_4_ | (uint)!bVar13 * auVar205._24_4_);
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar213._28_4_ =
               (float)((uint)bVar13 * auVar204._28_4_ | (uint)!bVar13 * auVar205._28_4_);
          auVar162 = vfmsub231ps_fma(auVar206,auVar213,auVar295);
          auVar102._8_4_ = 0x395e8083;
          auVar102._0_8_ = 0x395e8083395e8083;
          auVar102._12_4_ = 0x395e8083;
          auVar102._16_4_ = 0x395e8083;
          auVar102._20_4_ = 0x395e8083;
          auVar102._24_4_ = 0x395e8083;
          auVar102._28_4_ = 0x395e8083;
          auVar205 = vfmsub231ps_avx512vl(ZEXT1632(auVar162),auVar213,auVar102);
          auVar252._0_4_ = auVar205._0_4_ * auVar205._0_4_;
          auVar252._4_4_ = auVar205._4_4_ * auVar205._4_4_;
          auVar252._8_4_ = auVar205._8_4_ * auVar205._8_4_;
          auVar252._12_4_ = auVar205._12_4_ * auVar205._12_4_;
          auVar252._16_4_ = auVar205._16_4_ * auVar205._16_4_;
          auVar252._20_4_ = auVar205._20_4_ * auVar205._20_4_;
          auVar252._24_4_ = auVar205._24_4_ * auVar205._24_4_;
          auVar252._28_4_ = 0;
          auVar162 = vfmadd213ps_fma(auVar306,auVar205,auVar311);
          auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar205,auVar316);
          auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar205,auVar321);
          auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar205,auVar327);
          auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar205,auVar249);
          auVar162 = vfmadd213ps_fma(ZEXT1632(auVar162),auVar252,auVar205);
          auVar253._0_4_ = auVar162._0_4_ + 1.0;
          auVar253._4_4_ = auVar162._4_4_ + 1.0;
          auVar253._8_4_ = auVar162._8_4_ + 1.0;
          auVar253._12_4_ = auVar162._12_4_ + 1.0;
          auVar253._16_4_ = 0x3f800000;
          auVar253._20_4_ = 0x3f800000;
          auVar253._24_4_ = 0x3f800000;
          auVar253._28_4_ = 0x3f800000;
          auVar234._0_4_ = (int)auVar213._0_4_;
          auVar234._4_4_ = (int)auVar213._4_4_;
          auVar234._8_4_ = (int)auVar213._8_4_;
          auVar234._12_4_ = (int)auVar213._12_4_;
          auVar234._16_4_ = (int)auVar213._16_4_;
          auVar234._20_4_ = (int)auVar213._20_4_;
          auVar234._24_4_ = (int)auVar213._24_4_;
          auVar234._28_4_ = (int)auVar213._28_4_;
          auVar205 = vpslld_avx2(auVar234,0x17);
          auVar205 = vpaddd_avx2(auVar331,auVar205);
          auVar162 = vfmadd213ps_fma(auVar205,auVar253,auVar289);
          auVar205 = vrcpps_avx(ZEXT1632(auVar162));
          auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar205,auVar289);
          auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar205,auVar205);
          auVar212 = ZEXT1632(auVar162);
          break;
        case 5:
          auVar206 = vminps_avx512vl(auVar212,auVar193);
          auVar204 = vmaxps_avx512vl(auVar206,auVar194);
          auVar162 = vfmadd213ps_fma(auVar285,auVar204,auVar249);
          auVar206 = vroundps_avx(ZEXT1632(auVar162),1);
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar206,1);
          auVar202 = vsubps_avx512vl(auVar206,auVar289);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar207._0_4_ = (float)((uint)bVar13 * auVar202._0_4_ | (uint)!bVar13 * auVar206._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar207._4_4_ = (float)((uint)bVar13 * auVar202._4_4_ | (uint)!bVar13 * auVar206._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar207._8_4_ = (float)((uint)bVar13 * auVar202._8_4_ | (uint)!bVar13 * auVar206._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar207._12_4_ =
               (float)((uint)bVar13 * auVar202._12_4_ | (uint)!bVar13 * auVar206._12_4_);
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar207._16_4_ =
               (float)((uint)bVar13 * auVar202._16_4_ | (uint)!bVar13 * auVar206._16_4_);
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar207._20_4_ =
               (float)((uint)bVar13 * auVar202._20_4_ | (uint)!bVar13 * auVar206._20_4_);
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar207._24_4_ =
               (float)((uint)bVar13 * auVar202._24_4_ | (uint)!bVar13 * auVar206._24_4_);
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar207._28_4_ =
               (float)((uint)bVar13 * auVar202._28_4_ | (uint)!bVar13 * auVar206._28_4_);
          auVar162 = vfmsub231ps_fma(auVar204,auVar207,auVar295);
          auVar162 = vfnmsub231ps_fma(ZEXT1632(auVar162),auVar207,auVar335);
          auVar204 = ZEXT1632(auVar162);
          auVar206 = vfmadd213ps_avx512vl(auVar306,auVar204,auVar311);
          auVar206 = vfmadd213ps_avx512vl(auVar206,auVar204,auVar316);
          auVar206 = vfmadd213ps_avx512vl(auVar206,auVar204,auVar321);
          auVar204 = ZEXT1632(auVar162);
          auVar206 = vfmadd213ps_avx512vl(auVar206,auVar204,auVar327);
          auVar206 = vfmadd213ps_avx512vl(auVar206,auVar204,auVar249);
          auVar206 = vfmadd213ps_avx512vl
                               (auVar206,ZEXT1632(CONCAT412(auVar162._12_4_ * auVar162._12_4_,
                                                            CONCAT48(auVar162._8_4_ * auVar162._8_4_
                                                                     ,CONCAT44(auVar162._4_4_ *
                                                                               auVar162._4_4_,
                                                                               auVar162._0_4_ *
                                                                               auVar162._0_4_)))),
                                auVar204);
          auVar204 = vaddps_avx512vl(auVar206,auVar289);
          auVar269._0_4_ = (int)auVar207._0_4_;
          auVar269._4_4_ = (int)auVar207._4_4_;
          auVar269._8_4_ = (int)auVar207._8_4_;
          auVar269._12_4_ = (int)auVar207._12_4_;
          auVar269._16_4_ = (int)auVar207._16_4_;
          auVar269._20_4_ = (int)auVar207._20_4_;
          auVar269._24_4_ = (int)auVar207._24_4_;
          auVar269._28_4_ = (int)auVar207._28_4_;
          auVar206 = vpslld_avx2(auVar269,0x17);
          auVar206 = vpaddd_avx2(auVar331,auVar206);
          auVar162 = vfmadd213ps_fma(auVar206,auVar204,auVar289);
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar205,2);
          auVar92._8_4_ = 0x800000;
          auVar92._0_8_ = 0x80000000800000;
          auVar92._12_4_ = 0x800000;
          auVar92._16_4_ = 0x800000;
          auVar92._20_4_ = 0x800000;
          auVar92._24_4_ = 0x800000;
          auVar92._28_4_ = 0x800000;
          auVar205 = vmaxps_avx512vl(ZEXT1632(auVar162),auVar92);
          auVar202 = vpsrld_avx2(auVar205,0x17);
          auVar300._8_4_ = 0x807fffff;
          auVar300._0_8_ = 0x807fffff807fffff;
          auVar300._12_4_ = 0x807fffff;
          auVar300._16_4_ = 0x807fffff;
          auVar300._20_4_ = 0x807fffff;
          auVar300._24_4_ = 0x807fffff;
          auVar300._28_4_ = 0x807fffff;
          auVar93._8_4_ = 0x3f000000;
          auVar93._0_8_ = 0x3f0000003f000000;
          auVar93._12_4_ = 0x3f000000;
          auVar93._16_4_ = 0x3f000000;
          auVar93._20_4_ = 0x3f000000;
          auVar93._24_4_ = 0x3f000000;
          auVar93._28_4_ = 0x3f000000;
          auVar205 = vpternlogd_avx512vl(auVar205,auVar300,auVar93,0xea);
          auVar94._8_4_ = 0x3f3504f3;
          auVar94._0_8_ = 0x3f3504f33f3504f3;
          auVar94._12_4_ = 0x3f3504f3;
          auVar94._16_4_ = 0x3f3504f3;
          auVar94._20_4_ = 0x3f3504f3;
          auVar94._24_4_ = 0x3f3504f3;
          auVar94._28_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar205,auVar94,1);
          auVar206 = vaddps_avx512vl(auVar205,auVar188);
          auVar204 = vaddps_avx512vl(auVar206,auVar205);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar208._0_4_ = (float)((uint)bVar13 * auVar204._0_4_ | (uint)!bVar13 * auVar206._0_4_);
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar208._4_4_ = (float)((uint)bVar13 * auVar204._4_4_ | (uint)!bVar13 * auVar206._4_4_);
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar208._8_4_ = (float)((uint)bVar13 * auVar204._8_4_ | (uint)!bVar13 * auVar206._8_4_);
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar208._12_4_ =
               (float)((uint)bVar13 * auVar204._12_4_ | (uint)!bVar13 * auVar206._12_4_);
          bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar208._16_4_ =
               (float)((uint)bVar13 * auVar204._16_4_ | (uint)!bVar13 * auVar206._16_4_);
          bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar208._20_4_ =
               (float)((uint)bVar13 * auVar204._20_4_ | (uint)!bVar13 * auVar206._20_4_);
          bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar208._24_4_ =
               (float)((uint)bVar13 * auVar204._24_4_ | (uint)!bVar13 * auVar206._24_4_);
          bVar13 = SUB81(uVar16 >> 7,0);
          auVar208._28_4_ = (uint)bVar13 * auVar204._28_4_ | (uint)!bVar13 * auVar206._28_4_;
          auVar119._4_4_ = auVar208._4_4_ * auVar208._4_4_;
          auVar119._0_4_ = auVar208._0_4_ * auVar208._0_4_;
          auVar119._8_4_ = auVar208._8_4_ * auVar208._8_4_;
          auVar119._12_4_ = auVar208._12_4_ * auVar208._12_4_;
          auVar119._16_4_ = auVar208._16_4_ * auVar208._16_4_;
          auVar119._20_4_ = auVar208._20_4_ * auVar208._20_4_;
          auVar119._24_4_ = auVar208._24_4_ * auVar208._24_4_;
          auVar119._28_4_ = auVar205._28_4_;
          auVar95._8_4_ = 0xbdebd1b8;
          auVar95._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar95._12_4_ = 0xbdebd1b8;
          auVar95._16_4_ = 0xbdebd1b8;
          auVar95._20_4_ = 0xbdebd1b8;
          auVar95._24_4_ = 0xbdebd1b8;
          auVar95._28_4_ = 0xbdebd1b8;
          auVar205 = vfmadd213ps_avx512vl(auVar189,auVar208,auVar95);
          auVar96._8_4_ = 0x3def251a;
          auVar96._0_8_ = 0x3def251a3def251a;
          auVar96._12_4_ = 0x3def251a;
          auVar96._16_4_ = 0x3def251a;
          auVar96._20_4_ = 0x3def251a;
          auVar96._24_4_ = 0x3def251a;
          auVar96._28_4_ = 0x3def251a;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar96);
          auVar97._8_4_ = 0xbdfe5d4f;
          auVar97._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar97._12_4_ = 0xbdfe5d4f;
          auVar97._16_4_ = 0xbdfe5d4f;
          auVar97._20_4_ = 0xbdfe5d4f;
          auVar97._24_4_ = 0xbdfe5d4f;
          auVar97._28_4_ = 0xbdfe5d4f;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar97);
          auVar98._8_4_ = 0x3e11e9bf;
          auVar98._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar98._12_4_ = 0x3e11e9bf;
          auVar98._16_4_ = 0x3e11e9bf;
          auVar98._20_4_ = 0x3e11e9bf;
          auVar98._24_4_ = 0x3e11e9bf;
          auVar98._28_4_ = 0x3e11e9bf;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar98);
          auVar99._8_4_ = 0xbe2aae50;
          auVar99._0_8_ = 0xbe2aae50be2aae50;
          auVar99._12_4_ = 0xbe2aae50;
          auVar99._16_4_ = 0xbe2aae50;
          auVar99._20_4_ = 0xbe2aae50;
          auVar99._24_4_ = 0xbe2aae50;
          auVar99._28_4_ = 0xbe2aae50;
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar99);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar190);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar191);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar208,auVar192);
          auVar206 = vmulps_avx512vl(auVar119,auVar208);
          in_ZMM17 = ZEXT3264(auVar206);
          auVar206 = vmulps_avx512vl(auVar206,auVar205);
          auVar100._8_4_ = 0xffffff82;
          auVar100._0_8_ = 0xffffff82ffffff82;
          auVar100._12_4_ = 0xffffff82;
          auVar100._16_4_ = 0xffffff82;
          auVar100._20_4_ = 0xffffff82;
          auVar100._24_4_ = 0xffffff82;
          auVar100._28_4_ = 0xffffff82;
          auVar205 = vpaddd_avx512vl(auVar202,auVar100);
          auVar205 = vcvtdq2ps_avx(auVar205);
          auVar204 = vsubps_avx512vl(auVar205,auVar289);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar209._0_4_ = (uint)bVar13 * auVar204._0_4_ | (uint)!bVar13 * auVar205._0_4_;
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar209._4_4_ = (uint)bVar13 * auVar204._4_4_ | (uint)!bVar13 * auVar205._4_4_;
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar209._8_4_ = (uint)bVar13 * auVar204._8_4_ | (uint)!bVar13 * auVar205._8_4_;
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar209._12_4_ = (uint)bVar13 * auVar204._12_4_ | (uint)!bVar13 * auVar205._12_4_;
          bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar209._16_4_ = (uint)bVar13 * auVar204._16_4_ | (uint)!bVar13 * auVar205._16_4_;
          bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar209._20_4_ = (uint)bVar13 * auVar204._20_4_ | (uint)!bVar13 * auVar205._20_4_;
          bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar209._24_4_ = (uint)bVar13 * auVar204._24_4_ | (uint)!bVar13 * auVar205._24_4_;
          bVar13 = SUB81(uVar16 >> 7,0);
          auVar209._28_4_ = (uint)bVar13 * auVar204._28_4_ | (uint)!bVar13 * auVar205._28_4_;
          auVar205 = vfmadd231ps_avx512vl(auVar206,auVar209,auVar335);
          auVar205 = vfmsub231ps_avx512vl(auVar205,auVar249,auVar119);
          auVar205 = vsubps_avx512vl(auVar205,auVar208);
          auVar162 = vfmsub231ps_fma(auVar205,auVar295,auVar209);
          auVar205 = vmulps_avx512vl(ZEXT1632(auVar162),auVar201);
          auVar206 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar210._0_4_ = (uint)bVar13 * auVar206._0_4_ | (uint)!bVar13 * auVar205._0_4_;
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar210._4_4_ = (uint)bVar13 * auVar206._4_4_ | (uint)!bVar13 * auVar205._4_4_;
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar210._8_4_ = (uint)bVar13 * auVar206._8_4_ | (uint)!bVar13 * auVar205._8_4_;
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar210._12_4_ = (uint)bVar13 * auVar206._12_4_ | (uint)!bVar13 * auVar205._12_4_;
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar210._16_4_ = (uint)bVar13 * auVar206._16_4_ | (uint)!bVar13 * auVar205._16_4_;
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar210._20_4_ = (uint)bVar13 * auVar206._20_4_ | (uint)!bVar13 * auVar205._20_4_;
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar210._24_4_ = (uint)bVar13 * auVar206._24_4_ | (uint)!bVar13 * auVar205._24_4_;
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar210._28_4_ = (uint)bVar13 * auVar206._28_4_ | (uint)!bVar13 * auVar205._28_4_;
          auVar205 = vminps_avx512vl(auVar210,auVar193);
          auVar206 = vmaxps_avx512vl(auVar205,auVar194);
          auVar162 = vfmadd213ps_fma(auVar285,auVar206,auVar249);
          auVar205 = vroundps_avx(ZEXT1632(auVar162),1);
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar162),auVar205,1);
          auVar204 = vsubps_avx512vl(auVar205,auVar289);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar211._0_4_ = (float)((uint)bVar13 * auVar204._0_4_ | (uint)!bVar13 * auVar205._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar211._4_4_ = (float)((uint)bVar13 * auVar204._4_4_ | (uint)!bVar13 * auVar205._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar211._8_4_ = (float)((uint)bVar13 * auVar204._8_4_ | (uint)!bVar13 * auVar205._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar211._12_4_ =
               (float)((uint)bVar13 * auVar204._12_4_ | (uint)!bVar13 * auVar205._12_4_);
          bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar211._16_4_ =
               (float)((uint)bVar13 * auVar204._16_4_ | (uint)!bVar13 * auVar205._16_4_);
          bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar211._20_4_ =
               (float)((uint)bVar13 * auVar204._20_4_ | (uint)!bVar13 * auVar205._20_4_);
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar211._24_4_ =
               (float)((uint)bVar13 * auVar204._24_4_ | (uint)!bVar13 * auVar205._24_4_);
          bVar13 = SUB81(uVar15 >> 7,0);
          auVar211._28_4_ =
               (float)((uint)bVar13 * auVar204._28_4_ | (uint)!bVar13 * auVar205._28_4_);
          auVar162 = vfmsub231ps_fma(auVar206,auVar211,auVar295);
          auVar162 = vfnmsub231ps_fma(ZEXT1632(auVar162),auVar211,auVar335);
          auVar206 = ZEXT1632(auVar162);
          auVar205 = vfmadd213ps_avx512vl(auVar306,auVar206,auVar311);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar316);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar321);
          auVar206 = ZEXT1632(auVar162);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar327);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar206,auVar249);
          auVar205 = vfmadd213ps_avx512vl
                               (auVar205,ZEXT1632(CONCAT412(auVar162._12_4_ * auVar162._12_4_,
                                                            CONCAT48(auVar162._8_4_ * auVar162._8_4_
                                                                     ,CONCAT44(auVar162._4_4_ *
                                                                               auVar162._4_4_,
                                                                               auVar162._0_4_ *
                                                                               auVar162._0_4_)))),
                                auVar206);
          in_ZMM16 = ZEXT3264(auVar205);
          auVar206 = vaddps_avx512vl(auVar205,auVar289);
          auVar270._0_4_ = (int)auVar211._0_4_;
          auVar270._4_4_ = (int)auVar211._4_4_;
          auVar270._8_4_ = (int)auVar211._8_4_;
          auVar270._12_4_ = (int)auVar211._12_4_;
          auVar270._16_4_ = (int)auVar211._16_4_;
          auVar270._20_4_ = (int)auVar211._20_4_;
          auVar270._24_4_ = (int)auVar211._24_4_;
          auVar270._28_4_ = (int)auVar211._28_4_;
          auVar205 = vpslld_avx2(auVar270,0x17);
          auVar205 = vpaddd_avx2(auVar331,auVar205);
          auVar162 = vfmadd213ps_fma(auVar205,auVar206,auVar289);
          auVar205 = vrcpps_avx(ZEXT1632(auVar162));
          auVar162 = vfmsub213ps_fma(ZEXT1632(auVar162),auVar205,auVar289);
          auVar162 = vfnmadd132ps_fma(ZEXT1632(auVar162),auVar205,auVar205);
          auVar205 = vfnmadd213ps_avx512vl(ZEXT1632(auVar162),auVar201,auVar188);
          auVar212._4_4_ = auVar205._4_4_ * auVar212._4_4_;
          auVar212._0_4_ = auVar205._0_4_ * auVar212._0_4_;
          auVar212._8_4_ = auVar205._8_4_ * auVar212._8_4_;
          auVar212._12_4_ = auVar205._12_4_ * auVar212._12_4_;
          auVar212._16_4_ = auVar205._16_4_ * auVar212._16_4_;
          auVar212._20_4_ = auVar205._20_4_ * auVar212._20_4_;
          auVar212._24_4_ = auVar205._24_4_ * auVar212._24_4_;
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
          auVar254._4_4_ = uVar1;
          auVar254._0_4_ = uVar1;
          auVar254._8_4_ = uVar1;
          auVar254._12_4_ = uVar1;
          auVar254._16_4_ = uVar1;
          auVar254._20_4_ = uVar1;
          auVar254._24_4_ = uVar1;
          auVar254._28_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
          auVar206._4_4_ = uVar1;
          auVar206._0_4_ = uVar1;
          auVar206._8_4_ = uVar1;
          auVar206._12_4_ = uVar1;
          auVar206._16_4_ = uVar1;
          auVar206._20_4_ = uVar1;
          auVar206._24_4_ = uVar1;
          auVar206._28_4_ = uVar1;
          auVar206 = vfmadd213ps_avx512vl(auVar254,auVar212,auVar206);
          auVar205 = vmaxps_avx(auVar206,auVar205);
          auVar205 = vminps_avx(auVar205,auVar289);
          auVar212._4_4_ = auVar205._4_4_ * auVar212._4_4_;
          auVar212._0_4_ = auVar205._0_4_ * auVar212._0_4_;
          auVar212._8_4_ = auVar205._8_4_ * auVar212._8_4_;
          auVar212._12_4_ = auVar205._12_4_ * auVar212._12_4_;
          auVar212._16_4_ = auVar205._16_4_ * auVar212._16_4_;
          auVar212._20_4_ = auVar205._20_4_ * auVar212._20_4_;
          auVar212._24_4_ = auVar205._24_4_ * auVar212._24_4_;
        }
      }
      *(undefined1 (*) [32])((long)top_blob->data + uVar136 * 0x20) = auVar212;
      uVar136 = uVar136 + 1;
    } while (uVar136 != uVar157);
  }
  else {
    if ((iVar135 != 0x10) || ((int)uVar133 < 1)) goto LAB_002a99ee;
    auVar301 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar290 = vxorps_avx512dq(auVar301,(undefined1  [64])_ps512_cephes_log_q2);
    auVar296 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar301);
    auVar302 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
    auVar307 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar301);
    uVar136 = 0;
    auVar162 = vxorps_avx512vl(auVar162,auVar162);
    auVar322 = ZEXT1664(auVar162);
    auVar312 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar317 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      auVar162 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar328 = ZEXT1664(auVar162);
      if (lVar10 != 0) {
        auVar328 = *(undefined1 (*) [64])(lVar10 + uVar136 * 0x40);
      }
      pauVar141 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar136 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar163 = in_ZMM18._0_16_;
      auVar168 = in_ZMM23._0_16_;
      auVar166 = in_ZMM21._0_16_;
      auVar167 = in_ZMM22._0_16_;
      auVar164 = in_ZMM19._0_16_;
      auVar165 = in_ZMM20._0_16_;
      auVar162 = in_ZMM17._0_16_;
      pauVar144 = local_308;
      if ((int)uVar134 < 8) {
        auVar163 = vxorps_avx512vl(auVar163,auVar163);
        auVar337 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM23 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM21 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM22 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM19 = ZEXT1664(auVar163);
        auVar163 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM20 = ZEXT1664(auVar163);
        auVar162 = vxorps_avx512vl(auVar162,auVar162);
        auVar336 = ZEXT1664(auVar162);
        uVar133 = 0;
      }
      else {
        auVar162 = vxorps_avx512vl(auVar162,auVar162);
        auVar336 = ZEXT1664(auVar162);
        iVar145 = 7;
        auVar162 = vxorps_avx512vl(auVar165,auVar165);
        in_ZMM20 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar164,auVar164);
        in_ZMM19 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar167,auVar167);
        in_ZMM22 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar166,auVar166);
        in_ZMM21 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar168,auVar168);
        in_ZMM23 = ZEXT1664(auVar162);
        auVar162 = vxorps_avx512vl(auVar163,auVar163);
        auVar337 = ZEXT1664(auVar162);
        do {
          auVar214 = vcvtph2ps_avx512f(*pauVar141);
          auVar215 = vcvtph2ps_avx512f(pauVar141[1]);
          auVar216 = vcvtph2ps_avx512f(pauVar141[2]);
          auVar217 = vcvtph2ps_avx512f(pauVar141[3]);
          uVar1 = *(undefined4 *)*pauVar144;
          auVar218._4_4_ = uVar1;
          auVar218._0_4_ = uVar1;
          auVar218._8_4_ = uVar1;
          auVar218._12_4_ = uVar1;
          auVar218._16_4_ = uVar1;
          auVar218._20_4_ = uVar1;
          auVar218._24_4_ = uVar1;
          auVar218._28_4_ = uVar1;
          auVar218._32_4_ = uVar1;
          auVar218._36_4_ = uVar1;
          auVar218._40_4_ = uVar1;
          auVar218._44_4_ = uVar1;
          auVar218._48_4_ = uVar1;
          auVar218._52_4_ = uVar1;
          auVar218._56_4_ = uVar1;
          auVar218._60_4_ = uVar1;
          auVar328 = vfmadd231ps_avx512f(auVar328,auVar214,auVar218);
          uVar1 = *(undefined4 *)(*pauVar144 + 4);
          auVar214._4_4_ = uVar1;
          auVar214._0_4_ = uVar1;
          auVar214._8_4_ = uVar1;
          auVar214._12_4_ = uVar1;
          auVar214._16_4_ = uVar1;
          auVar214._20_4_ = uVar1;
          auVar214._24_4_ = uVar1;
          auVar214._28_4_ = uVar1;
          auVar214._32_4_ = uVar1;
          auVar214._36_4_ = uVar1;
          auVar214._40_4_ = uVar1;
          auVar214._44_4_ = uVar1;
          auVar214._48_4_ = uVar1;
          auVar214._52_4_ = uVar1;
          auVar214._56_4_ = uVar1;
          auVar214._60_4_ = uVar1;
          auVar336 = vfmadd231ps_avx512f(auVar336,auVar215,auVar214);
          uVar1 = *(undefined4 *)(*pauVar144 + 8);
          auVar215._4_4_ = uVar1;
          auVar215._0_4_ = uVar1;
          auVar215._8_4_ = uVar1;
          auVar215._12_4_ = uVar1;
          auVar215._16_4_ = uVar1;
          auVar215._20_4_ = uVar1;
          auVar215._24_4_ = uVar1;
          auVar215._28_4_ = uVar1;
          auVar215._32_4_ = uVar1;
          auVar215._36_4_ = uVar1;
          auVar215._40_4_ = uVar1;
          auVar215._44_4_ = uVar1;
          auVar215._48_4_ = uVar1;
          auVar215._52_4_ = uVar1;
          auVar215._56_4_ = uVar1;
          auVar215._60_4_ = uVar1;
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar216,auVar215);
          uVar1 = *(undefined4 *)(*pauVar144 + 0xc);
          auVar216._4_4_ = uVar1;
          auVar216._0_4_ = uVar1;
          auVar216._8_4_ = uVar1;
          auVar216._12_4_ = uVar1;
          auVar216._16_4_ = uVar1;
          auVar216._20_4_ = uVar1;
          auVar216._24_4_ = uVar1;
          auVar216._28_4_ = uVar1;
          auVar216._32_4_ = uVar1;
          auVar216._36_4_ = uVar1;
          auVar216._40_4_ = uVar1;
          auVar216._44_4_ = uVar1;
          auVar216._48_4_ = uVar1;
          auVar216._52_4_ = uVar1;
          auVar216._56_4_ = uVar1;
          auVar216._60_4_ = uVar1;
          in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar217,auVar216);
          auVar218 = vcvtph2ps_avx512f(pauVar141[4]);
          auVar214 = vcvtph2ps_avx512f(pauVar141[5]);
          auVar215 = vcvtph2ps_avx512f(pauVar141[6]);
          auVar216 = vcvtph2ps_avx512f(pauVar141[7]);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x10);
          auVar217._4_4_ = uVar1;
          auVar217._0_4_ = uVar1;
          auVar217._8_4_ = uVar1;
          auVar217._12_4_ = uVar1;
          auVar217._16_4_ = uVar1;
          auVar217._20_4_ = uVar1;
          auVar217._24_4_ = uVar1;
          auVar217._28_4_ = uVar1;
          auVar217._32_4_ = uVar1;
          auVar217._36_4_ = uVar1;
          auVar217._40_4_ = uVar1;
          auVar217._44_4_ = uVar1;
          auVar217._48_4_ = uVar1;
          auVar217._52_4_ = uVar1;
          auVar217._56_4_ = uVar1;
          auVar217._60_4_ = uVar1;
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar218,auVar217);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x14);
          auVar106._4_4_ = uVar1;
          auVar106._0_4_ = uVar1;
          auVar106._8_4_ = uVar1;
          auVar106._12_4_ = uVar1;
          auVar106._16_4_ = uVar1;
          auVar106._20_4_ = uVar1;
          auVar106._24_4_ = uVar1;
          auVar106._28_4_ = uVar1;
          auVar106._32_4_ = uVar1;
          auVar106._36_4_ = uVar1;
          auVar106._40_4_ = uVar1;
          auVar106._44_4_ = uVar1;
          auVar106._48_4_ = uVar1;
          auVar106._52_4_ = uVar1;
          auVar106._56_4_ = uVar1;
          auVar106._60_4_ = uVar1;
          in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar214,auVar106);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x18);
          auVar107._4_4_ = uVar1;
          auVar107._0_4_ = uVar1;
          auVar107._8_4_ = uVar1;
          auVar107._12_4_ = uVar1;
          auVar107._16_4_ = uVar1;
          auVar107._20_4_ = uVar1;
          auVar107._24_4_ = uVar1;
          auVar107._28_4_ = uVar1;
          auVar107._32_4_ = uVar1;
          auVar107._36_4_ = uVar1;
          auVar107._40_4_ = uVar1;
          auVar107._44_4_ = uVar1;
          auVar107._48_4_ = uVar1;
          auVar107._52_4_ = uVar1;
          auVar107._56_4_ = uVar1;
          auVar107._60_4_ = uVar1;
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar215,auVar107);
          uVar1 = *(undefined4 *)(*pauVar144 + 0x1c);
          auVar108._4_4_ = uVar1;
          auVar108._0_4_ = uVar1;
          auVar108._8_4_ = uVar1;
          auVar108._12_4_ = uVar1;
          auVar108._16_4_ = uVar1;
          auVar108._20_4_ = uVar1;
          auVar108._24_4_ = uVar1;
          auVar108._28_4_ = uVar1;
          auVar108._32_4_ = uVar1;
          auVar108._36_4_ = uVar1;
          auVar108._40_4_ = uVar1;
          auVar108._44_4_ = uVar1;
          auVar108._48_4_ = uVar1;
          auVar108._52_4_ = uVar1;
          auVar108._56_4_ = uVar1;
          auVar108._60_4_ = uVar1;
          auVar337 = vfmadd231ps_avx512f(auVar337,auVar216,auVar108);
          pauVar144 = pauVar144 + 1;
          pauVar141 = pauVar141 + 8;
          iVar145 = iVar145 + 8;
          uVar133 = uVar134 & 0xfffffff8;
        } while (iVar145 < (int)uVar134);
      }
      uVar148 = uVar133 | 3;
      while ((int)uVar148 < (int)uVar134) {
        auVar218 = vcvtph2ps_avx512f(*pauVar141);
        auVar214 = vcvtph2ps_avx512f(pauVar141[1]);
        auVar215 = vcvtph2ps_avx512f(pauVar141[2]);
        auVar216 = vcvtph2ps_avx512f(pauVar141[3]);
        uVar1 = *(undefined4 *)*pauVar144;
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar109._16_4_ = uVar1;
        auVar109._20_4_ = uVar1;
        auVar109._24_4_ = uVar1;
        auVar109._28_4_ = uVar1;
        auVar109._32_4_ = uVar1;
        auVar109._36_4_ = uVar1;
        auVar109._40_4_ = uVar1;
        auVar109._44_4_ = uVar1;
        auVar109._48_4_ = uVar1;
        auVar109._52_4_ = uVar1;
        auVar109._56_4_ = uVar1;
        auVar109._60_4_ = uVar1;
        auVar328 = vfmadd231ps_avx512f(auVar328,auVar218,auVar109);
        uVar1 = *(undefined4 *)(*pauVar144 + 4);
        auVar110._4_4_ = uVar1;
        auVar110._0_4_ = uVar1;
        auVar110._8_4_ = uVar1;
        auVar110._12_4_ = uVar1;
        auVar110._16_4_ = uVar1;
        auVar110._20_4_ = uVar1;
        auVar110._24_4_ = uVar1;
        auVar110._28_4_ = uVar1;
        auVar110._32_4_ = uVar1;
        auVar110._36_4_ = uVar1;
        auVar110._40_4_ = uVar1;
        auVar110._44_4_ = uVar1;
        auVar110._48_4_ = uVar1;
        auVar110._52_4_ = uVar1;
        auVar110._56_4_ = uVar1;
        auVar110._60_4_ = uVar1;
        auVar336 = vfmadd231ps_avx512f(auVar336,auVar214,auVar110);
        uVar1 = *(undefined4 *)(*pauVar144 + 8);
        auVar111._4_4_ = uVar1;
        auVar111._0_4_ = uVar1;
        auVar111._8_4_ = uVar1;
        auVar111._12_4_ = uVar1;
        auVar111._16_4_ = uVar1;
        auVar111._20_4_ = uVar1;
        auVar111._24_4_ = uVar1;
        auVar111._28_4_ = uVar1;
        auVar111._32_4_ = uVar1;
        auVar111._36_4_ = uVar1;
        auVar111._40_4_ = uVar1;
        auVar111._44_4_ = uVar1;
        auVar111._48_4_ = uVar1;
        auVar111._52_4_ = uVar1;
        auVar111._56_4_ = uVar1;
        auVar111._60_4_ = uVar1;
        in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar215,auVar111);
        uVar1 = *(undefined4 *)(*pauVar144 + 0xc);
        auVar112._4_4_ = uVar1;
        auVar112._0_4_ = uVar1;
        auVar112._8_4_ = uVar1;
        auVar112._12_4_ = uVar1;
        auVar112._16_4_ = uVar1;
        auVar112._20_4_ = uVar1;
        auVar112._24_4_ = uVar1;
        auVar112._28_4_ = uVar1;
        auVar112._32_4_ = uVar1;
        auVar112._36_4_ = uVar1;
        auVar112._40_4_ = uVar1;
        auVar112._44_4_ = uVar1;
        auVar112._48_4_ = uVar1;
        auVar112._52_4_ = uVar1;
        auVar112._56_4_ = uVar1;
        auVar112._60_4_ = uVar1;
        in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar216,auVar112);
        pauVar144 = (undefined1 (*) [32])(*pauVar144 + 0x10);
        pauVar141 = pauVar141 + 4;
        uVar148 = uVar133 + 7;
        uVar133 = uVar133 + 4;
      }
      if (uVar134 - uVar133 != 0 && (int)uVar133 <= (int)uVar134) {
        lVar146 = 0;
        do {
          auVar193 = vlddqu_avx(*pauVar141);
          auVar218 = vcvtph2ps_avx512f(auVar193);
          uVar1 = *(undefined4 *)(*pauVar144 + lVar146 * 4);
          auVar113._4_4_ = uVar1;
          auVar113._0_4_ = uVar1;
          auVar113._8_4_ = uVar1;
          auVar113._12_4_ = uVar1;
          auVar113._16_4_ = uVar1;
          auVar113._20_4_ = uVar1;
          auVar113._24_4_ = uVar1;
          auVar113._28_4_ = uVar1;
          auVar113._32_4_ = uVar1;
          auVar113._36_4_ = uVar1;
          auVar113._40_4_ = uVar1;
          auVar113._44_4_ = uVar1;
          auVar113._48_4_ = uVar1;
          auVar113._52_4_ = uVar1;
          auVar113._56_4_ = uVar1;
          auVar113._60_4_ = uVar1;
          auVar328 = vfmadd231ps_avx512f(auVar328,auVar218,auVar113);
          pauVar141 = pauVar141 + 1;
          lVar146 = lVar146 + 1;
        } while (uVar134 - uVar133 != (int)lVar146);
      }
      auVar337 = vaddps_avx512f(in_ZMM23,auVar337);
      auVar218 = vaddps_avx512f(in_ZMM21,in_ZMM22);
      auVar337 = vaddps_avx512f(auVar337,auVar218);
      in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
      in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar336);
      auVar336 = vaddps_avx512f(auVar337,in_ZMM17);
      auVar328 = vaddps_avx512f(auVar336,auVar328);
      in_ZMM16 = auVar328;
      switch(iVar7) {
      case 1:
        in_ZMM16 = vmaxps_avx512f(auVar328,auVar322);
        break;
      case 2:
        uVar15 = vcmpps_avx512f(auVar328,auVar322,1);
        uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
        auVar115._4_4_ = uVar1;
        auVar115._0_4_ = uVar1;
        auVar115._8_4_ = uVar1;
        auVar115._12_4_ = uVar1;
        auVar115._16_4_ = uVar1;
        auVar115._20_4_ = uVar1;
        auVar115._24_4_ = uVar1;
        auVar115._28_4_ = uVar1;
        auVar115._32_4_ = uVar1;
        auVar115._36_4_ = uVar1;
        auVar115._40_4_ = uVar1;
        auVar115._44_4_ = uVar1;
        auVar115._48_4_ = uVar1;
        auVar115._52_4_ = uVar1;
        auVar115._56_4_ = uVar1;
        auVar115._60_4_ = uVar1;
        auVar336 = vmulps_avx512f(auVar328,auVar115);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM16._0_4_ = (uint)bVar13 * auVar336._0_4_ | (uint)!bVar13 * auVar328._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM16._4_4_ = (uint)bVar13 * auVar336._4_4_ | (uint)!bVar13 * auVar328._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM16._8_4_ = (uint)bVar13 * auVar336._8_4_ | (uint)!bVar13 * auVar328._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM16._12_4_ = (uint)bVar13 * auVar336._12_4_ | (uint)!bVar13 * auVar328._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM16._16_4_ = (uint)bVar13 * auVar336._16_4_ | (uint)!bVar13 * auVar328._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM16._20_4_ = (uint)bVar13 * auVar336._20_4_ | (uint)!bVar13 * auVar328._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM16._24_4_ = (uint)bVar13 * auVar336._24_4_ | (uint)!bVar13 * auVar328._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM16._28_4_ = (uint)bVar13 * auVar336._28_4_ | (uint)!bVar13 * auVar328._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM16._32_4_ = (uint)bVar13 * auVar336._32_4_ | (uint)!bVar13 * auVar328._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM16._36_4_ = (uint)bVar13 * auVar336._36_4_ | (uint)!bVar13 * auVar328._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM16._40_4_ = (uint)bVar13 * auVar336._40_4_ | (uint)!bVar13 * auVar328._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM16._44_4_ = (uint)bVar13 * auVar336._44_4_ | (uint)!bVar13 * auVar328._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM16._48_4_ = (uint)bVar13 * auVar336._48_4_ | (uint)!bVar13 * auVar328._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM16._52_4_ = (uint)bVar13 * auVar336._52_4_ | (uint)!bVar13 * auVar328._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM16._56_4_ = (uint)bVar13 * auVar336._56_4_ | (uint)!bVar13 * auVar328._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM16._60_4_ = (uint)bVar13 * auVar336._60_4_ | (uint)!bVar13 * auVar328._60_4_;
        break;
      case 3:
        uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var8);
        auVar114._4_4_ = uVar1;
        auVar114._0_4_ = uVar1;
        auVar114._8_4_ = uVar1;
        auVar114._12_4_ = uVar1;
        auVar114._16_4_ = uVar1;
        auVar114._20_4_ = uVar1;
        auVar114._24_4_ = uVar1;
        auVar114._28_4_ = uVar1;
        auVar114._32_4_ = uVar1;
        auVar114._36_4_ = uVar1;
        auVar114._40_4_ = uVar1;
        auVar114._44_4_ = uVar1;
        auVar114._48_4_ = uVar1;
        auVar114._52_4_ = uVar1;
        auVar114._56_4_ = uVar1;
        auVar114._60_4_ = uVar1;
        auVar336 = vmaxps_avx512f(auVar328,auVar114);
        uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var8))[1];
        auVar328._4_4_ = uVar1;
        auVar328._0_4_ = uVar1;
        auVar328._8_4_ = uVar1;
        auVar328._12_4_ = uVar1;
        auVar328._16_4_ = uVar1;
        auVar328._20_4_ = uVar1;
        auVar328._24_4_ = uVar1;
        auVar328._28_4_ = uVar1;
        auVar328._32_4_ = uVar1;
        auVar328._36_4_ = uVar1;
        auVar328._40_4_ = uVar1;
        auVar328._44_4_ = uVar1;
        auVar328._48_4_ = uVar1;
        auVar328._52_4_ = uVar1;
        auVar328._56_4_ = uVar1;
        auVar328._60_4_ = uVar1;
        in_ZMM16 = vminps_avx512f(auVar336,auVar328);
        break;
      case 4:
        auVar328 = vxorps_avx512dq(auVar328,auVar301);
        auVar328 = vminps_avx512f(auVar328,(undefined1  [64])afVar121);
        auVar328 = vmaxps_avx512f(auVar328,(undefined1  [64])afVar122);
        auVar336 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar328,
                                       (undefined1  [64])afVar129);
        auVar337 = vrndscaleps_avx512f(auVar336,1);
        uVar15 = vcmpps_avx512f(auVar336,auVar337,1);
        auVar336 = vsubps_avx512f(auVar337,(undefined1  [64])afVar120);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM17._0_4_ = (uint)bVar13 * auVar336._0_4_ | (uint)!bVar13 * auVar337._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM17._4_4_ = (uint)bVar13 * auVar336._4_4_ | (uint)!bVar13 * auVar337._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM17._8_4_ = (uint)bVar13 * auVar336._8_4_ | (uint)!bVar13 * auVar337._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM17._12_4_ = (uint)bVar13 * auVar336._12_4_ | (uint)!bVar13 * auVar337._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM17._16_4_ = (uint)bVar13 * auVar336._16_4_ | (uint)!bVar13 * auVar337._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM17._20_4_ = (uint)bVar13 * auVar336._20_4_ | (uint)!bVar13 * auVar337._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM17._24_4_ = (uint)bVar13 * auVar336._24_4_ | (uint)!bVar13 * auVar337._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM17._28_4_ = (uint)bVar13 * auVar336._28_4_ | (uint)!bVar13 * auVar337._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM17._32_4_ = (uint)bVar13 * auVar336._32_4_ | (uint)!bVar13 * auVar337._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM17._36_4_ = (uint)bVar13 * auVar336._36_4_ | (uint)!bVar13 * auVar337._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM17._40_4_ = (uint)bVar13 * auVar336._40_4_ | (uint)!bVar13 * auVar337._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM17._44_4_ = (uint)bVar13 * auVar336._44_4_ | (uint)!bVar13 * auVar337._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM17._48_4_ = (uint)bVar13 * auVar336._48_4_ | (uint)!bVar13 * auVar337._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM17._52_4_ = (uint)bVar13 * auVar336._52_4_ | (uint)!bVar13 * auVar337._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM17._56_4_ = (uint)bVar13 * auVar336._56_4_ | (uint)!bVar13 * auVar337._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM17._60_4_ = (uint)bVar13 * auVar336._60_4_ | (uint)!bVar13 * auVar337._60_4_;
        auVar328 = vfmadd231ps_avx512f(auVar328,in_ZMM17,auVar290);
        auVar328 = vfmadd231ps_avx512f(auVar328,in_ZMM17,auVar296);
        auVar336 = vmulps_avx512f(auVar328,auVar328);
        auVar337 = vfmadd213ps_avx512f(auVar328,(undefined1  [64])afVar124,
                                       (undefined1  [64])afVar125);
        auVar337 = vfmadd213ps_avx512f(auVar337,auVar328,(undefined1  [64])afVar126);
        auVar337 = vfmadd213ps_avx512f(auVar337,auVar328,(undefined1  [64])afVar127);
        auVar337 = vfmadd213ps_avx512f(auVar337,auVar328,(undefined1  [64])afVar128);
        auVar337 = vfmadd213ps_avx512f(auVar337,auVar328,(undefined1  [64])afVar129);
        in_ZMM18 = vfmadd213ps_avx512f(auVar337,auVar336,auVar328);
        auVar328 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar120);
        auVar336 = vcvttps2dq_avx512f(in_ZMM17);
        auVar336 = vpaddd_avx512f(auVar336,auVar302);
        auVar336 = vpslld_avx512f(auVar336,0x17);
        auVar328 = vfmadd213ps_avx512f(auVar336,auVar328,auVar312);
        auVar336 = vrcp14ps_avx512f(auVar328);
        auVar328 = vfmsub213ps_avx512f(auVar328,auVar336,auVar312);
        in_ZMM16 = vfnmadd132ps_avx512vl(auVar328,auVar336,auVar336);
        break;
      case 5:
        auVar336 = vminps_avx512f(auVar328,(undefined1  [64])afVar121);
        auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar122);
        auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar336,
                                       (undefined1  [64])afVar129);
        auVar218 = vrndscaleps_avx512f(auVar337,1);
        uVar15 = vcmpps_avx512f(auVar337,auVar218,1);
        auVar214 = vsubps_avx512f(auVar218,(undefined1  [64])afVar120);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar337._0_4_ = (uint)bVar13 * auVar214._0_4_ | (uint)!bVar13 * auVar218._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar337._4_4_ = (uint)bVar13 * auVar214._4_4_ | (uint)!bVar13 * auVar218._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar337._8_4_ = (uint)bVar13 * auVar214._8_4_ | (uint)!bVar13 * auVar218._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar337._12_4_ = (uint)bVar13 * auVar214._12_4_ | (uint)!bVar13 * auVar218._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar337._16_4_ = (uint)bVar13 * auVar214._16_4_ | (uint)!bVar13 * auVar218._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar337._20_4_ = (uint)bVar13 * auVar214._20_4_ | (uint)!bVar13 * auVar218._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar337._24_4_ = (uint)bVar13 * auVar214._24_4_ | (uint)!bVar13 * auVar218._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar337._28_4_ = (uint)bVar13 * auVar214._28_4_ | (uint)!bVar13 * auVar218._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        auVar337._32_4_ = (uint)bVar13 * auVar214._32_4_ | (uint)!bVar13 * auVar218._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar337._36_4_ = (uint)bVar13 * auVar214._36_4_ | (uint)!bVar13 * auVar218._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar337._40_4_ = (uint)bVar13 * auVar214._40_4_ | (uint)!bVar13 * auVar218._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar337._44_4_ = (uint)bVar13 * auVar214._44_4_ | (uint)!bVar13 * auVar218._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar337._48_4_ = (uint)bVar13 * auVar214._48_4_ | (uint)!bVar13 * auVar218._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar337._52_4_ = (uint)bVar13 * auVar214._52_4_ | (uint)!bVar13 * auVar218._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar337._56_4_ = (uint)bVar13 * auVar214._56_4_ | (uint)!bVar13 * auVar218._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar337._60_4_ = (uint)bVar13 * auVar214._60_4_ | (uint)!bVar13 * auVar218._60_4_;
        auVar336 = vfmadd231ps_avx512f(auVar336,auVar337,auVar290);
        auVar336 = vfmadd231ps_avx512f(auVar336,auVar337,auVar296);
        auVar218 = vmulps_avx512f(auVar336,auVar336);
        auVar214 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar124,
                                       (undefined1  [64])afVar125);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar336,(undefined1  [64])afVar126);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar336,(undefined1  [64])afVar127);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar336,(undefined1  [64])afVar128);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar336,(undefined1  [64])afVar129);
        auVar336 = vfmadd213ps_avx512f(auVar214,auVar218,auVar336);
        auVar336 = vaddps_avx512f(auVar336,(undefined1  [64])afVar120);
        auVar337 = vcvttps2dq_avx512f(auVar337);
        auVar337 = vpaddd_avx512f(auVar337,auVar302);
        auVar337 = vpslld_avx512f(auVar337,0x17);
        auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar312);
        auVar337 = vmaxps_avx512f(auVar336,(undefined1  [64])_ps512_min_norm_pos);
        auVar218 = vpsrld_avx512f(auVar337,0x17);
        auVar337 = vpternlogd_avx512f(auVar337,(undefined1  [64])afVar129,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar15 = vcmpps_avx512f(auVar337,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar214 = vsubps_avx512f(auVar337,(undefined1  [64])afVar120);
        auVar337 = vaddps_avx512f(auVar214,auVar337);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar219._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar214._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar219._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar214._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar219._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar214._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar219._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar214._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar219._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar214._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar219._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar214._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar219._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar214._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar219._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar214._28_4_;
        bVar14 = (byte)(uVar15 >> 8);
        bVar13 = (bool)(bVar14 & 1);
        auVar219._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar214._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar219._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar214._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar219._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar214._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar219._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar214._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar219._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar214._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar219._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar214._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar219._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar214._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar219._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar214._60_4_;
        auVar337 = vmulps_avx512f(auVar219,auVar219);
        auVar214 = vfmadd132ps_avx512f(auVar219,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p2);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p3);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p4);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p5);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p6);
        auVar214 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p7);
        in_ZMM20 = vfmadd213ps_avx512f(auVar214,auVar219,(undefined1  [64])_ps512_cephes_log_p8);
        auVar214 = vmulps_avx512f(auVar337,auVar219);
        auVar214 = vfmadd213ps_avx512f(auVar214,in_ZMM20,auVar219);
        uVar16 = vcmpps_avx512f(auVar336,auVar322,2);
        auVar336 = vpsubd_avx512f(auVar218,auVar302);
        auVar336 = vcvtdq2ps_avx512f(auVar336);
        auVar218 = vaddps_avx512f(auVar336,(undefined1  [64])afVar120);
        bVar13 = (bool)((byte)uVar15 & 1);
        auVar220._0_4_ = (uint)bVar13 * auVar336._0_4_ | (uint)!bVar13 * auVar218._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar220._4_4_ = (uint)bVar13 * auVar336._4_4_ | (uint)!bVar13 * auVar218._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar220._8_4_ = (uint)bVar13 * auVar336._8_4_ | (uint)!bVar13 * auVar218._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar220._12_4_ = (uint)bVar13 * auVar336._12_4_ | (uint)!bVar13 * auVar218._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar220._16_4_ = (uint)bVar13 * auVar336._16_4_ | (uint)!bVar13 * auVar218._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar220._20_4_ = (uint)bVar13 * auVar336._20_4_ | (uint)!bVar13 * auVar218._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar220._24_4_ = (uint)bVar13 * auVar336._24_4_ | (uint)!bVar13 * auVar218._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar220._28_4_ = (uint)bVar13 * auVar336._28_4_ | (uint)!bVar13 * auVar218._28_4_;
        bVar13 = (bool)(bVar14 & 1);
        auVar220._32_4_ = (uint)bVar13 * auVar336._32_4_ | (uint)!bVar13 * auVar218._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        auVar220._36_4_ = (uint)bVar13 * auVar336._36_4_ | (uint)!bVar13 * auVar218._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        auVar220._40_4_ = (uint)bVar13 * auVar336._40_4_ | (uint)!bVar13 * auVar218._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        auVar220._44_4_ = (uint)bVar13 * auVar336._44_4_ | (uint)!bVar13 * auVar218._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        auVar220._48_4_ = (uint)bVar13 * auVar336._48_4_ | (uint)!bVar13 * auVar218._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        auVar220._52_4_ = (uint)bVar13 * auVar336._52_4_ | (uint)!bVar13 * auVar218._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        auVar220._56_4_ = (uint)bVar13 * auVar336._56_4_ | (uint)!bVar13 * auVar218._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        auVar220._60_4_ = (uint)bVar13 * auVar336._60_4_ | (uint)!bVar13 * auVar218._60_4_;
        auVar336 = vfmadd231ps_avx512f(auVar214,auVar220,(undefined1  [64])afVar130);
        auVar336 = vfmadd231ps_avx512f(auVar336,auVar307,auVar337);
        in_ZMM21 = vfmadd231ps_avx512f(auVar336,auVar220,(undefined1  [64])_ps512_cephes_log_q2);
        auVar336 = vmulps_avx512f(in_ZMM21,auVar317);
        auVar337 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        bVar13 = (bool)((byte)uVar16 & 1);
        auVar221._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar336._0_4_;
        bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar221._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar336._4_4_;
        bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar221._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar336._8_4_;
        bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar221._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar336._12_4_;
        bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar221._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar336._16_4_;
        bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar221._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar336._20_4_;
        bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar221._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar336._24_4_;
        bVar13 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar221._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar336._28_4_;
        bVar13 = (bool)((byte)(uVar16 >> 8) & 1);
        auVar221._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar336._32_4_;
        bVar13 = (bool)((byte)(uVar16 >> 9) & 1);
        auVar221._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar336._36_4_;
        bVar13 = (bool)((byte)(uVar16 >> 10) & 1);
        auVar221._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar336._40_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xb) & 1);
        auVar221._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar336._44_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xc) & 1);
        auVar221._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar336._48_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xd) & 1);
        auVar221._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar336._52_4_;
        bVar13 = (bool)((byte)(uVar16 >> 0xe) & 1);
        auVar221._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar336._56_4_;
        bVar13 = SUB81(uVar16 >> 0xf,0);
        auVar221._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar336._60_4_;
        auVar336 = vminps_avx512f(auVar221,(undefined1  [64])afVar121);
        auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar122);
        auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar123,auVar336,
                                       (undefined1  [64])afVar129);
        auVar218 = vrndscaleps_avx512f(auVar337,1);
        uVar15 = vcmpps_avx512f(auVar337,auVar218,1);
        auVar337 = vsubps_avx512f(auVar218,(undefined1  [64])afVar120);
        bVar13 = (bool)((byte)uVar15 & 1);
        in_ZMM18._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar218._0_4_;
        bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
        in_ZMM18._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar218._4_4_;
        bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
        in_ZMM18._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar218._8_4_;
        bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
        in_ZMM18._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar218._12_4_;
        bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
        in_ZMM18._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar218._16_4_;
        bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
        in_ZMM18._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar218._20_4_;
        bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
        in_ZMM18._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar218._24_4_;
        bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
        in_ZMM18._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar218._28_4_;
        bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
        in_ZMM18._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar218._32_4_;
        bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
        in_ZMM18._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar218._36_4_;
        bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
        in_ZMM18._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar218._40_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
        in_ZMM18._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar218._44_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
        in_ZMM18._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar218._48_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
        in_ZMM18._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar218._52_4_;
        bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
        in_ZMM18._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar218._56_4_;
        bVar13 = SUB81(uVar15 >> 0xf,0);
        in_ZMM18._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar218._60_4_;
        auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar290);
        auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar296);
        auVar337 = vmulps_avx512f(auVar336,auVar336);
        auVar218 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar124,
                                       (undefined1  [64])afVar125);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar126);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar127);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar128);
        auVar218 = vfmadd213ps_avx512f(auVar218,auVar336,(undefined1  [64])afVar129);
        in_ZMM19 = vfmadd213ps_avx512f(auVar218,auVar337,auVar336);
        auVar336 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar120);
        auVar337 = vcvttps2dq_avx512f(in_ZMM18);
        auVar337 = vpaddd_avx512f(auVar337,auVar302);
        auVar337 = vpslld_avx512f(auVar337,0x17);
        auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar312);
        auVar337 = vrcp14ps_avx512f(auVar336);
        auVar336 = vfmsub213ps_avx512f(auVar336,auVar337,auVar312);
        auVar336 = vfnmadd132ps_avx512vl(auVar336,auVar337,auVar337);
        in_ZMM17 = vfnmsub213ps_avx512f(auVar336,auVar317,auVar312);
        in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar328);
        break;
      case 6:
        auVar337 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var8)));
        uVar133 = (*(uint **)(&this->field_0xe8 + (long)p_Var8))[1];
        auVar336._4_4_ = uVar133;
        auVar336._0_4_ = uVar133;
        auVar336._8_4_ = uVar133;
        auVar336._12_4_ = uVar133;
        auVar336._16_4_ = uVar133;
        auVar336._20_4_ = uVar133;
        auVar336._24_4_ = uVar133;
        auVar336._28_4_ = uVar133;
        auVar336._32_4_ = uVar133;
        auVar336._36_4_ = uVar133;
        auVar336._40_4_ = uVar133;
        auVar336._44_4_ = uVar133;
        auVar336._48_4_ = uVar133;
        auVar336._52_4_ = uVar133;
        auVar336._56_4_ = uVar133;
        auVar336._60_4_ = uVar133;
        auVar336 = vfmadd213ps_avx512f(auVar337,auVar328,auVar336);
        auVar336 = vmaxps_avx512f(auVar336,auVar322);
        auVar336 = vminps_avx512f(auVar336,auVar312);
        in_ZMM16 = vmulps_avx512f(auVar336,auVar328);
      }
      *(undefined1 (*) [64])((long)top_blob->data + uVar136 * 0x40) = in_ZMM16;
      uVar136 = uVar136 + 1;
    } while (uVar136 != uVar157);
  }
  iVar145 = 0;
LAB_002a99ee:
  if (piStack_300 != (int *)0x0) {
    LOCK();
    *piStack_300 = *piStack_300 + -1;
    UNLOCK();
    if (*piStack_300 == 0) {
      if (local_2e8 == (Allocator *)0x0) {
        if (local_308 != (undefined1 (*) [32])0x0) {
          free(local_308);
        }
      }
      else {
        (*local_2e8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar145;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}